

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tests.c
# Opt level: O0

void test_ecdsa_edge_cases(void)

{
  secp256k1_context *psVar1;
  int iVar2;
  size_t outlen;
  uchar seckey [32];
  uchar privkey [300];
  unsigned_long _zzq_result_7;
  unsigned_long _zzq_args_7 [6];
  unsigned_long _zzq_result_6;
  unsigned_long _zzq_args_6 [6];
  unsigned_long _zzq_result_5;
  unsigned_long _zzq_args_5 [6];
  unsigned_long _zzq_result_4;
  unsigned_long _zzq_args_4 [6];
  unsigned_long _zzq_result_3;
  unsigned_long _zzq_args_3 [6];
  unsigned_long _zzq_result_2;
  unsigned_long _zzq_args_2 [6];
  unsigned_long _zzq_result_1;
  unsigned_long _zzq_args_1 [6];
  unsigned_long _zzq_result;
  unsigned_long _zzq_args [6];
  uchar nonce4 [32];
  uchar nonce3 [32];
  uchar nonce2_1 [32];
  uchar nonce_1 [32];
  uchar zeros [32];
  int j_1;
  int j;
  uchar *extra;
  secp256k1_scalar ss_6;
  secp256k1_scalar sr_6 [512];
  secp256k1_ecdsa_signature sig2;
  uchar msg_7 [32];
  uchar key_7 [32];
  int i;
  secp256k1_callback _saved_callback_17;
  int32_t _calls_to_callback_17;
  secp256k1_callback _saved_callback_16;
  int32_t _calls_to_callback_16;
  secp256k1_callback _saved_callback_15;
  int32_t _calls_to_callback_15;
  secp256k1_callback _saved_callback_14;
  int32_t _calls_to_callback_14;
  secp256k1_callback _saved_callback_13;
  int32_t _calls_to_callback_13;
  secp256k1_callback _saved_callback_12;
  int32_t _calls_to_callback_12;
  secp256k1_callback _saved_callback_11;
  int32_t _calls_to_callback_11;
  secp256k1_callback _saved_callback_10;
  int32_t _calls_to_callback_10;
  secp256k1_callback _saved_callback_9;
  int32_t _calls_to_callback_9;
  secp256k1_callback _saved_callback_8;
  int32_t _calls_to_callback_8;
  secp256k1_callback _saved_callback_7;
  int32_t _calls_to_callback_7;
  secp256k1_callback _saved_callback_6;
  int32_t _calls_to_callback_6;
  secp256k1_callback _saved_callback_5;
  int32_t _calls_to_callback_5;
  secp256k1_callback _saved_callback_4;
  int32_t _calls_to_callback_4;
  secp256k1_callback _saved_callback_3;
  int32_t _calls_to_callback_3;
  secp256k1_callback _saved_callback_2;
  int32_t _calls_to_callback_2;
  secp256k1_callback _saved_callback_1;
  int32_t _calls_to_callback_1;
  secp256k1_callback _saved_callback;
  int32_t _calls_to_callback;
  uchar msg_6 [32];
  uchar key_6 [32];
  uchar signature [72];
  size_t siglen;
  secp256k1_pubkey pubkey_4;
  secp256k1_scalar ss_5;
  secp256k1_scalar sr_5;
  secp256k1_scalar msg_5;
  secp256k1_ge key_5;
  uchar csr_1 [32];
  uchar pubkey_3 [33];
  secp256k1_scalar ss_4;
  secp256k1_scalar sr_4;
  secp256k1_scalar msg_4;
  secp256k1_ge key2_1;
  secp256k1_ge key_4;
  uchar csr [32];
  uchar pubkey2_1 [33];
  uchar pubkey_2 [33];
  secp256k1_scalar ss_3;
  secp256k1_scalar sr_3;
  secp256k1_scalar msg_3;
  secp256k1_ge key2;
  secp256k1_ge key_3;
  uchar pubkey2 [33];
  uchar pubkey_1 [33];
  secp256k1_scalar ss_2;
  secp256k1_scalar sr_2;
  secp256k1_scalar msg_2;
  secp256k1_ge key_2;
  uchar pubkey [33];
  secp256k1_scalar ss_1;
  secp256k1_scalar sr_1;
  secp256k1_scalar msg_1;
  secp256k1_ge key_1;
  uchar pubkey_mods_zero [33];
  secp256k1_scalar ss;
  secp256k1_scalar sr;
  secp256k1_scalar msg;
  secp256k1_ge key;
  secp256k1_gej keyj;
  secp256k1_ecdsa_signature sig;
  int t;
  undefined4 in_stack_ffffffffffffb178;
  uint in_stack_ffffffffffffb17c;
  secp256k1_context *in_stack_ffffffffffffb180;
  secp256k1_scalar *in_stack_ffffffffffffb188;
  secp256k1_scalar *in_stack_ffffffffffffb190;
  secp256k1_scalar *in_stack_ffffffffffffb198;
  secp256k1_scalar *in_stack_ffffffffffffb1a0;
  secp256k1_ecdsa_signature *in_stack_ffffffffffffb1b0;
  secp256k1_ecdsa_signature *in_stack_ffffffffffffb1b8;
  secp256k1_ecdsa_signature *in_stack_ffffffffffffb1c0;
  undefined4 in_stack_ffffffffffffb1c8;
  int in_stack_ffffffffffffb1cc;
  secp256k1_ge *in_stack_ffffffffffffb1d0;
  secp256k1_nonce_function in_stack_ffffffffffffb1d8;
  uchar *in_stack_ffffffffffffb1e0;
  secp256k1_context *in_stack_ffffffffffffb1e8;
  secp256k1_ecdsa_signature *in_stack_ffffffffffffb1f0;
  secp256k1_context *in_stack_ffffffffffffb1f8;
  secp256k1_pubkey *in_stack_ffffffffffffb200;
  secp256k1_context *in_stack_ffffffffffffb208;
  secp256k1_pubkey *in_stack_ffffffffffffb230;
  uchar *in_stack_ffffffffffffb238;
  secp256k1_ecdsa_signature *in_stack_ffffffffffffb240;
  secp256k1_context *in_stack_ffffffffffffb248;
  uint in_stack_ffffffffffffb27c;
  void *in_stack_ffffffffffffb280;
  uchar *in_stack_ffffffffffffb288;
  uchar *in_stack_ffffffffffffb290;
  uchar *in_stack_ffffffffffffb298;
  uchar *in_stack_ffffffffffffb2a0;
  secp256k1_scalar *in_stack_ffffffffffffb2b0;
  secp256k1_gej *in_stack_ffffffffffffb2b8;
  secp256k1_ecmult_gen_context *in_stack_ffffffffffffb2c0;
  secp256k1_scalar *in_stack_ffffffffffffb320;
  secp256k1_ge *in_stack_ffffffffffffb328;
  secp256k1_scalar *in_stack_ffffffffffffb330;
  secp256k1_scalar *in_stack_ffffffffffffb338;
  undefined1 local_4b28 [32];
  undefined1 local_4b08 [32];
  undefined1 local_4ae8 [32];
  undefined1 local_4ac8 [32];
  undefined1 local_4aa8 [32];
  int local_4a88;
  int local_4a84;
  uchar *local_4a80;
  secp256k1_scalar local_4a78;
  secp256k1_scalar local_4a58 [512];
  secp256k1_ecdsa_signature local_a58;
  undefined1 local_a18 [31];
  undefined1 local_9f9;
  undefined1 local_9f8 [31];
  undefined1 local_9d9;
  int local_9cc;
  _func_void_char_ptr_void_ptr *local_9c8;
  void *local_9c0;
  int local_9b4;
  _func_void_char_ptr_void_ptr *local_9b0;
  void *local_9a8;
  int local_99c;
  _func_void_char_ptr_void_ptr *local_998;
  void *local_990;
  int local_984;
  _func_void_char_ptr_void_ptr *local_980;
  void *local_978;
  int local_96c;
  _func_void_char_ptr_void_ptr *local_968;
  void *local_960;
  int local_954;
  _func_void_char_ptr_void_ptr *local_950;
  void *local_948;
  int local_93c;
  _func_void_char_ptr_void_ptr *local_938;
  void *local_930;
  int local_924;
  _func_void_char_ptr_void_ptr *local_920;
  void *local_918;
  int local_90c;
  _func_void_char_ptr_void_ptr *local_908;
  void *local_900;
  int local_8f4;
  _func_void_char_ptr_void_ptr *local_8f0;
  void *local_8e8;
  int local_8dc;
  _func_void_char_ptr_void_ptr *local_8d8;
  void *local_8d0;
  int local_8c4;
  _func_void_char_ptr_void_ptr *local_8c0;
  void *local_8b8;
  int local_8ac;
  _func_void_char_ptr_void_ptr *local_8a8;
  void *local_8a0;
  int local_894;
  _func_void_char_ptr_void_ptr *local_890;
  void *local_888;
  int local_87c;
  _func_void_char_ptr_void_ptr *local_878;
  void *local_870;
  int local_864;
  _func_void_char_ptr_void_ptr *local_860;
  void *local_858;
  int local_84c;
  _func_void_char_ptr_void_ptr *local_848;
  void *local_840;
  int local_834;
  _func_void_char_ptr_void_ptr *local_830;
  void *local_828;
  int local_81c;
  undefined8 local_818;
  undefined8 local_810;
  undefined8 local_808;
  undefined8 local_800;
  undefined8 local_7f8;
  undefined8 local_7f0;
  undefined8 local_7e8;
  undefined8 local_7e0;
  undefined1 local_7d8 [80];
  undefined8 local_788;
  undefined8 local_688;
  undefined8 local_680;
  undefined8 local_678;
  undefined8 local_670;
  undefined1 local_668 [320];
  undefined8 local_528;
  undefined8 local_520;
  undefined8 local_518;
  undefined8 local_510;
  undefined1 local_508 [48];
  undefined1 local_4d8 [320];
  undefined1 local_398 [48];
  undefined1 local_368 [32];
  undefined1 local_348;
  undefined1 local_288 [32];
  undefined1 local_268;
  undefined1 local_1a8 [40];
  undefined8 local_180;
  undefined8 local_178;
  undefined8 local_170;
  undefined8 local_168;
  undefined8 local_140;
  undefined8 local_138;
  undefined8 local_130;
  undefined8 local_128;
  undefined1 local_44 [64];
  int local_4;
  
  secp256k1_scalar_set_int((secp256k1_scalar *)in_stack_ffffffffffffb180,in_stack_ffffffffffffb17c);
  secp256k1_scalar_negate(in_stack_ffffffffffffb190,in_stack_ffffffffffffb188);
  secp256k1_scalar_inverse(in_stack_ffffffffffffb1a0,in_stack_ffffffffffffb198);
  secp256k1_scalar_set_int((secp256k1_scalar *)in_stack_ffffffffffffb180,in_stack_ffffffffffffb17c);
  secp256k1_ecmult_gen
            (in_stack_ffffffffffffb2c0,in_stack_ffffffffffffb2b8,in_stack_ffffffffffffb2b0);
  secp256k1_ge_set_gej
            (in_stack_ffffffffffffb1d0,
             (secp256k1_gej *)CONCAT44(in_stack_ffffffffffffb1cc,in_stack_ffffffffffffb1c8));
  local_140 = local_180;
  local_138 = local_178;
  local_130 = local_170;
  local_128 = local_168;
  iVar2 = secp256k1_ecdsa_sig_verify
                    (in_stack_ffffffffffffb338,in_stack_ffffffffffffb330,in_stack_ffffffffffffb328,
                     in_stack_ffffffffffffb320);
  if (iVar2 != 0) {
    fprintf(_stderr,"%s:%d: %s\n",
            "/workspace/llm4binary/github/license_c_cmakelists/bitcoin[P]bitcoin/src/secp256k1/src/tests.c"
            ,0x1b9f,"test condition failed: secp256k1_ecdsa_sig_verify(&sr, &ss, &key, &msg) == 0");
    abort();
  }
  memcpy(local_1a8,&DAT_00166610,0x21);
  secp256k1_scalar_set_int((secp256k1_scalar *)in_stack_ffffffffffffb180,in_stack_ffffffffffffb17c);
  secp256k1_scalar_set_int((secp256k1_scalar *)in_stack_ffffffffffffb180,in_stack_ffffffffffffb17c);
  secp256k1_scalar_set_int((secp256k1_scalar *)in_stack_ffffffffffffb180,in_stack_ffffffffffffb17c);
  iVar2 = secp256k1_eckey_pubkey_parse
                    ((secp256k1_ge *)in_stack_ffffffffffffb208,in_stack_ffffffffffffb200->data,
                     (size_t)in_stack_ffffffffffffb1f8);
  if (iVar2 == 0) {
    fprintf(_stderr,"%s:%d: %s\n",
            "/workspace/llm4binary/github/license_c_cmakelists/bitcoin[P]bitcoin/src/secp256k1/src/tests.c"
            ,0x1bb1,
            "test condition failed: secp256k1_eckey_pubkey_parse(&key, pubkey_mods_zero, 33)");
    abort();
  }
  iVar2 = secp256k1_ecdsa_sig_verify
                    (in_stack_ffffffffffffb338,in_stack_ffffffffffffb330,in_stack_ffffffffffffb328,
                     in_stack_ffffffffffffb320);
  if (iVar2 != 0) {
    fprintf(_stderr,"%s:%d: %s\n",
            "/workspace/llm4binary/github/license_c_cmakelists/bitcoin[P]bitcoin/src/secp256k1/src/tests.c"
            ,0x1bb2,"test condition failed: secp256k1_ecdsa_sig_verify( &sr, &ss, &key, &msg) == 0")
    ;
    abort();
  }
  memset(local_288,0,0x21);
  local_288[0] = 2;
  local_268 = 1;
  secp256k1_scalar_set_int((secp256k1_scalar *)in_stack_ffffffffffffb180,in_stack_ffffffffffffb17c);
  secp256k1_scalar_set_int((secp256k1_scalar *)in_stack_ffffffffffffb180,in_stack_ffffffffffffb17c);
  secp256k1_scalar_set_int((secp256k1_scalar *)in_stack_ffffffffffffb180,in_stack_ffffffffffffb17c);
  iVar2 = secp256k1_eckey_pubkey_parse
                    ((secp256k1_ge *)in_stack_ffffffffffffb208,in_stack_ffffffffffffb200->data,
                     (size_t)in_stack_ffffffffffffb1f8);
  if (iVar2 == 0) {
    fprintf(_stderr,"%s:%d: %s\n",
            "/workspace/llm4binary/github/license_c_cmakelists/bitcoin[P]bitcoin/src/secp256k1/src/tests.c"
            ,0x1bc4,"test condition failed: secp256k1_eckey_pubkey_parse(&key, pubkey, 33)");
    abort();
  }
  iVar2 = secp256k1_ecdsa_sig_verify
                    (in_stack_ffffffffffffb338,in_stack_ffffffffffffb330,in_stack_ffffffffffffb328,
                     in_stack_ffffffffffffb320);
  if (iVar2 != 0) {
    fprintf(_stderr,"%s:%d: %s\n",
            "/workspace/llm4binary/github/license_c_cmakelists/bitcoin[P]bitcoin/src/secp256k1/src/tests.c"
            ,0x1bc5,"test condition failed: secp256k1_ecdsa_sig_verify(&sr, &ss, &key, &msg) == 0");
    abort();
  }
  memset(local_368,0,0x21);
  local_368[0] = 2;
  local_348 = 2;
  memcpy(local_398,&DAT_00166640,0x21);
  secp256k1_scalar_set_int((secp256k1_scalar *)in_stack_ffffffffffffb180,in_stack_ffffffffffffb17c);
  secp256k1_scalar_set_int((secp256k1_scalar *)in_stack_ffffffffffffb180,in_stack_ffffffffffffb17c);
  secp256k1_scalar_set_int((secp256k1_scalar *)in_stack_ffffffffffffb180,in_stack_ffffffffffffb17c);
  iVar2 = secp256k1_eckey_pubkey_parse
                    ((secp256k1_ge *)in_stack_ffffffffffffb208,in_stack_ffffffffffffb200->data,
                     (size_t)in_stack_ffffffffffffb1f8);
  if (iVar2 == 0) {
    fprintf(_stderr,"%s:%d: %s\n",
            "/workspace/llm4binary/github/license_c_cmakelists/bitcoin[P]bitcoin/src/secp256k1/src/tests.c"
            ,0x1bdf,"test condition failed: secp256k1_eckey_pubkey_parse(&key, pubkey, 33)");
    abort();
  }
  iVar2 = secp256k1_eckey_pubkey_parse
                    ((secp256k1_ge *)in_stack_ffffffffffffb208,in_stack_ffffffffffffb200->data,
                     (size_t)in_stack_ffffffffffffb1f8);
  if (iVar2 == 0) {
    fprintf(_stderr,"%s:%d: %s\n",
            "/workspace/llm4binary/github/license_c_cmakelists/bitcoin[P]bitcoin/src/secp256k1/src/tests.c"
            ,0x1be0,"test condition failed: secp256k1_eckey_pubkey_parse(&key2, pubkey2, 33)");
    abort();
  }
  iVar2 = secp256k1_ecdsa_sig_verify
                    (in_stack_ffffffffffffb338,in_stack_ffffffffffffb330,in_stack_ffffffffffffb328,
                     in_stack_ffffffffffffb320);
  if (iVar2 != 1) {
    fprintf(_stderr,"%s:%d: %s\n",
            "/workspace/llm4binary/github/license_c_cmakelists/bitcoin[P]bitcoin/src/secp256k1/src/tests.c"
            ,0x1be1,"test condition failed: secp256k1_ecdsa_sig_verify(&sr, &ss, &key, &msg) == 1");
    abort();
  }
  iVar2 = secp256k1_ecdsa_sig_verify
                    (in_stack_ffffffffffffb338,in_stack_ffffffffffffb330,in_stack_ffffffffffffb328,
                     in_stack_ffffffffffffb320);
  if (iVar2 != 1) {
    fprintf(_stderr,"%s:%d: %s\n",
            "/workspace/llm4binary/github/license_c_cmakelists/bitcoin[P]bitcoin/src/secp256k1/src/tests.c"
            ,0x1be2,"test condition failed: secp256k1_ecdsa_sig_verify(&sr, &ss, &key2, &msg) == 1")
    ;
    abort();
  }
  secp256k1_scalar_negate(in_stack_ffffffffffffb190,in_stack_ffffffffffffb188);
  iVar2 = secp256k1_ecdsa_sig_verify
                    (in_stack_ffffffffffffb338,in_stack_ffffffffffffb330,in_stack_ffffffffffffb328,
                     in_stack_ffffffffffffb320);
  if (iVar2 != 1) {
    fprintf(_stderr,"%s:%d: %s\n",
            "/workspace/llm4binary/github/license_c_cmakelists/bitcoin[P]bitcoin/src/secp256k1/src/tests.c"
            ,0x1be4,"test condition failed: secp256k1_ecdsa_sig_verify(&sr, &ss, &key, &msg) == 1");
    abort();
  }
  iVar2 = secp256k1_ecdsa_sig_verify
                    (in_stack_ffffffffffffb338,in_stack_ffffffffffffb330,in_stack_ffffffffffffb328,
                     in_stack_ffffffffffffb320);
  if (iVar2 != 1) {
    fprintf(_stderr,"%s:%d: %s\n",
            "/workspace/llm4binary/github/license_c_cmakelists/bitcoin[P]bitcoin/src/secp256k1/src/tests.c"
            ,0x1be5,"test condition failed: secp256k1_ecdsa_sig_verify(&sr, &ss, &key2, &msg) == 1")
    ;
    abort();
  }
  secp256k1_scalar_set_int((secp256k1_scalar *)in_stack_ffffffffffffb180,in_stack_ffffffffffffb17c);
  iVar2 = secp256k1_ecdsa_sig_verify
                    (in_stack_ffffffffffffb338,in_stack_ffffffffffffb330,in_stack_ffffffffffffb328,
                     in_stack_ffffffffffffb320);
  if (iVar2 != 0) {
    fprintf(_stderr,"%s:%d: %s\n",
            "/workspace/llm4binary/github/license_c_cmakelists/bitcoin[P]bitcoin/src/secp256k1/src/tests.c"
            ,0x1be7,"test condition failed: secp256k1_ecdsa_sig_verify(&sr, &ss, &key, &msg) == 0");
    abort();
  }
  iVar2 = secp256k1_ecdsa_sig_verify
                    (in_stack_ffffffffffffb338,in_stack_ffffffffffffb330,in_stack_ffffffffffffb328,
                     in_stack_ffffffffffffb320);
  if (iVar2 != 0) {
    fprintf(_stderr,"%s:%d: %s\n",
            "/workspace/llm4binary/github/license_c_cmakelists/bitcoin[P]bitcoin/src/secp256k1/src/tests.c"
            ,0x1be8,"test condition failed: secp256k1_ecdsa_sig_verify(&sr, &ss, &key2, &msg) == 0")
    ;
    abort();
  }
  memcpy(local_4d8,&DAT_00166670,0x21);
  memcpy(local_508,&DAT_001666a0,0x21);
  local_528 = 0;
  local_520 = 0x100000000000000;
  local_518 = 0xc45fb75019235145;
  local_510 = 0xebbac92f72a12d40;
  secp256k1_scalar_set_int((secp256k1_scalar *)in_stack_ffffffffffffb180,in_stack_ffffffffffffb17c);
  secp256k1_scalar_set_int((secp256k1_scalar *)in_stack_ffffffffffffb180,in_stack_ffffffffffffb17c);
  secp256k1_scalar_set_b32
            (in_stack_ffffffffffffb190,(uchar *)in_stack_ffffffffffffb188,
             (int *)in_stack_ffffffffffffb180);
  iVar2 = secp256k1_eckey_pubkey_parse
                    ((secp256k1_ge *)in_stack_ffffffffffffb208,in_stack_ffffffffffffb200->data,
                     (size_t)in_stack_ffffffffffffb1f8);
  if (iVar2 == 0) {
    fprintf(_stderr,"%s:%d: %s\n",
            "/workspace/llm4binary/github/license_c_cmakelists/bitcoin[P]bitcoin/src/secp256k1/src/tests.c"
            ,0x1c08,"test condition failed: secp256k1_eckey_pubkey_parse(&key, pubkey, 33)");
    abort();
  }
  iVar2 = secp256k1_eckey_pubkey_parse
                    ((secp256k1_ge *)in_stack_ffffffffffffb208,in_stack_ffffffffffffb200->data,
                     (size_t)in_stack_ffffffffffffb1f8);
  if (iVar2 == 0) {
    fprintf(_stderr,"%s:%d: %s\n",
            "/workspace/llm4binary/github/license_c_cmakelists/bitcoin[P]bitcoin/src/secp256k1/src/tests.c"
            ,0x1c09,"test condition failed: secp256k1_eckey_pubkey_parse(&key2, pubkey2, 33)");
    abort();
  }
  iVar2 = secp256k1_ecdsa_sig_verify
                    (in_stack_ffffffffffffb338,in_stack_ffffffffffffb330,in_stack_ffffffffffffb328,
                     in_stack_ffffffffffffb320);
  if (iVar2 != 1) {
    fprintf(_stderr,"%s:%d: %s\n",
            "/workspace/llm4binary/github/license_c_cmakelists/bitcoin[P]bitcoin/src/secp256k1/src/tests.c"
            ,0x1c0a,"test condition failed: secp256k1_ecdsa_sig_verify(&sr, &ss, &key, &msg) == 1");
    abort();
  }
  iVar2 = secp256k1_ecdsa_sig_verify
                    (in_stack_ffffffffffffb338,in_stack_ffffffffffffb330,in_stack_ffffffffffffb328,
                     in_stack_ffffffffffffb320);
  if (iVar2 != 1) {
    fprintf(_stderr,"%s:%d: %s\n",
            "/workspace/llm4binary/github/license_c_cmakelists/bitcoin[P]bitcoin/src/secp256k1/src/tests.c"
            ,0x1c0b,"test condition failed: secp256k1_ecdsa_sig_verify(&sr, &ss, &key2, &msg) == 1")
    ;
    abort();
  }
  secp256k1_scalar_negate(in_stack_ffffffffffffb190,in_stack_ffffffffffffb188);
  iVar2 = secp256k1_ecdsa_sig_verify
                    (in_stack_ffffffffffffb338,in_stack_ffffffffffffb330,in_stack_ffffffffffffb328,
                     in_stack_ffffffffffffb320);
  if (iVar2 != 1) {
    fprintf(_stderr,"%s:%d: %s\n",
            "/workspace/llm4binary/github/license_c_cmakelists/bitcoin[P]bitcoin/src/secp256k1/src/tests.c"
            ,0x1c0d,"test condition failed: secp256k1_ecdsa_sig_verify(&sr, &ss, &key, &msg) == 1");
    abort();
  }
  iVar2 = secp256k1_ecdsa_sig_verify
                    (in_stack_ffffffffffffb338,in_stack_ffffffffffffb330,in_stack_ffffffffffffb328,
                     in_stack_ffffffffffffb320);
  if (iVar2 != 1) {
    fprintf(_stderr,"%s:%d: %s\n",
            "/workspace/llm4binary/github/license_c_cmakelists/bitcoin[P]bitcoin/src/secp256k1/src/tests.c"
            ,0x1c0e,"test condition failed: secp256k1_ecdsa_sig_verify(&sr, &ss, &key2, &msg) == 1")
    ;
    abort();
  }
  secp256k1_scalar_set_int((secp256k1_scalar *)in_stack_ffffffffffffb180,in_stack_ffffffffffffb17c);
  secp256k1_scalar_inverse_var(in_stack_ffffffffffffb1a0,in_stack_ffffffffffffb198);
  iVar2 = secp256k1_ecdsa_sig_verify
                    (in_stack_ffffffffffffb338,in_stack_ffffffffffffb330,in_stack_ffffffffffffb328,
                     in_stack_ffffffffffffb320);
  if (iVar2 != 0) {
    fprintf(_stderr,"%s:%d: %s\n",
            "/workspace/llm4binary/github/license_c_cmakelists/bitcoin[P]bitcoin/src/secp256k1/src/tests.c"
            ,0x1c11,"test condition failed: secp256k1_ecdsa_sig_verify(&sr, &ss, &key, &msg) == 0");
    abort();
  }
  iVar2 = secp256k1_ecdsa_sig_verify
                    (in_stack_ffffffffffffb338,in_stack_ffffffffffffb330,in_stack_ffffffffffffb328,
                     in_stack_ffffffffffffb320);
  if (iVar2 != 0) {
    fprintf(_stderr,"%s:%d: %s\n",
            "/workspace/llm4binary/github/license_c_cmakelists/bitcoin[P]bitcoin/src/secp256k1/src/tests.c"
            ,0x1c12,"test condition failed: secp256k1_ecdsa_sig_verify(&sr, &ss, &key2, &msg) == 0")
    ;
    abort();
  }
  memcpy(local_668,&DAT_001666d0,0x21);
  local_688 = 0;
  local_680 = 0x100000000000000;
  local_678 = 0xc45fb75019235145;
  local_670 = 0xeebac92f72a12d40;
  secp256k1_scalar_set_int((secp256k1_scalar *)in_stack_ffffffffffffb180,in_stack_ffffffffffffb17c);
  secp256k1_scalar_set_int((secp256k1_scalar *)in_stack_ffffffffffffb180,in_stack_ffffffffffffb17c);
  secp256k1_scalar_negate(in_stack_ffffffffffffb190,in_stack_ffffffffffffb188);
  secp256k1_scalar_set_b32
            (in_stack_ffffffffffffb190,(uchar *)in_stack_ffffffffffffb188,
             (int *)in_stack_ffffffffffffb180);
  iVar2 = secp256k1_eckey_pubkey_parse
                    ((secp256k1_ge *)in_stack_ffffffffffffb208,in_stack_ffffffffffffb200->data,
                     (size_t)in_stack_ffffffffffffb1f8);
  if (iVar2 == 0) {
    fprintf(_stderr,"%s:%d: %s\n",
            "/workspace/llm4binary/github/license_c_cmakelists/bitcoin[P]bitcoin/src/secp256k1/src/tests.c"
            ,0x1c2b,"test condition failed: secp256k1_eckey_pubkey_parse(&key, pubkey, 33)");
    abort();
  }
  iVar2 = secp256k1_ecdsa_sig_verify
                    (in_stack_ffffffffffffb338,in_stack_ffffffffffffb330,in_stack_ffffffffffffb328,
                     in_stack_ffffffffffffb320);
  if (iVar2 != 1) {
    fprintf(_stderr,"%s:%d: %s\n",
            "/workspace/llm4binary/github/license_c_cmakelists/bitcoin[P]bitcoin/src/secp256k1/src/tests.c"
            ,0x1c2c,"test condition failed: secp256k1_ecdsa_sig_verify(&sr, &ss, &key, &msg) == 1");
    abort();
  }
  secp256k1_scalar_negate(in_stack_ffffffffffffb190,in_stack_ffffffffffffb188);
  iVar2 = secp256k1_ecdsa_sig_verify
                    (in_stack_ffffffffffffb338,in_stack_ffffffffffffb330,in_stack_ffffffffffffb328,
                     in_stack_ffffffffffffb320);
  if (iVar2 != 1) {
    fprintf(_stderr,"%s:%d: %s\n",
            "/workspace/llm4binary/github/license_c_cmakelists/bitcoin[P]bitcoin/src/secp256k1/src/tests.c"
            ,0x1c2e,"test condition failed: secp256k1_ecdsa_sig_verify(&sr, &ss, &key, &msg) == 1");
    abort();
  }
  secp256k1_scalar_set_int((secp256k1_scalar *)in_stack_ffffffffffffb180,in_stack_ffffffffffffb17c);
  secp256k1_scalar_inverse_var(in_stack_ffffffffffffb1a0,in_stack_ffffffffffffb198);
  iVar2 = secp256k1_ecdsa_sig_verify
                    (in_stack_ffffffffffffb338,in_stack_ffffffffffffb330,in_stack_ffffffffffffb328,
                     in_stack_ffffffffffffb320);
  if (iVar2 != 0) {
    fprintf(_stderr,"%s:%d: %s\n",
            "/workspace/llm4binary/github/license_c_cmakelists/bitcoin[P]bitcoin/src/secp256k1/src/tests.c"
            ,0x1c31,"test condition failed: secp256k1_ecdsa_sig_verify(&sr, &ss, &key, &msg) == 0");
    abort();
  }
  local_7f8 = 0;
  local_7f0 = 0;
  local_7e8 = 0;
  local_7e0 = 0x100000000000000;
  local_818 = 0x5344230681994186;
  local_810 = 0xf7f478316a9d5faa;
  local_808 = 0x62777a810be012b8;
  local_800 = 0xa9293eb931dddf65;
  iVar2 = secp256k1_ecdsa_sign
                    (in_stack_ffffffffffffb1f8,in_stack_ffffffffffffb1f0,
                     (uchar *)in_stack_ffffffffffffb1e8,in_stack_ffffffffffffb1e0,
                     in_stack_ffffffffffffb1d8,in_stack_ffffffffffffb1d0);
  if (iVar2 != 0) {
    fprintf(_stderr,"%s:%d: %s\n",
            "/workspace/llm4binary/github/license_c_cmakelists/bitcoin[P]bitcoin/src/secp256k1/src/tests.c"
            ,0x1c51,
            "test condition failed: secp256k1_ecdsa_sign(CTX, &sig, msg, key, precomputed_nonce_function, nonce) == 0"
           );
    abort();
  }
  iVar2 = secp256k1_ecdsa_sign
                    (in_stack_ffffffffffffb1f8,in_stack_ffffffffffffb1f0,
                     (uchar *)in_stack_ffffffffffffb1e8,in_stack_ffffffffffffb1e0,
                     in_stack_ffffffffffffb1d8,in_stack_ffffffffffffb1d0);
  if (iVar2 != 0) {
    fprintf(_stderr,"%s:%d: %s\n",
            "/workspace/llm4binary/github/license_c_cmakelists/bitcoin[P]bitcoin/src/secp256k1/src/tests.c"
            ,0x1c52,
            "test condition failed: secp256k1_ecdsa_sign(CTX, &sig, msg, key, precomputed_nonce_function, nonce2) == 0"
           );
    abort();
  }
  local_800 = CONCAT17(0xaa,(undefined7)local_800);
  iVar2 = secp256k1_ecdsa_sign
                    (in_stack_ffffffffffffb1f8,in_stack_ffffffffffffb1f0,
                     (uchar *)in_stack_ffffffffffffb1e8,in_stack_ffffffffffffb1e0,
                     in_stack_ffffffffffffb1d8,in_stack_ffffffffffffb1d0);
  if (iVar2 != 1) {
    fprintf(_stderr,"%s:%d: %s\n",
            "/workspace/llm4binary/github/license_c_cmakelists/bitcoin[P]bitcoin/src/secp256k1/src/tests.c"
            ,0x1c54,
            "test condition failed: secp256k1_ecdsa_sign(CTX, &sig, msg, key, precomputed_nonce_function, nonce) == 1"
           );
    abort();
  }
  local_81c = 0;
  local_830 = (CTX->illegal_callback).fn;
  local_828 = (CTX->illegal_callback).data;
  secp256k1_context_set_illegal_callback
            (in_stack_ffffffffffffb180,
             (_func_void_char_ptr_void_ptr *)
             CONCAT44(in_stack_ffffffffffffb17c,in_stack_ffffffffffffb178),(void *)0x1467d7);
  iVar2 = secp256k1_ecdsa_sign
                    (in_stack_ffffffffffffb1f8,in_stack_ffffffffffffb1f0,
                     (uchar *)in_stack_ffffffffffffb1e8,in_stack_ffffffffffffb1e0,
                     in_stack_ffffffffffffb1d8,in_stack_ffffffffffffb1d0);
  psVar1 = CTX;
  if (iVar2 != 0) {
    fprintf(_stderr,"%s:%d: %s\n",
            "/workspace/llm4binary/github/license_c_cmakelists/bitcoin[P]bitcoin/src/secp256k1/src/tests.c"
            ,0x1c55,
            "test condition failed: (secp256k1_ecdsa_sign(CTX, ((void*)0), msg, key, precomputed_nonce_function, nonce2)) == 0"
           );
    abort();
  }
  (CTX->illegal_callback).fn = local_830;
  (psVar1->illegal_callback).data = local_828;
  if (local_81c != 1) {
    fprintf(_stderr,"%s:%d: %s\n",
            "/workspace/llm4binary/github/license_c_cmakelists/bitcoin[P]bitcoin/src/secp256k1/src/tests.c"
            ,0x1c55,"test condition failed: _calls_to_callback == 1");
    abort();
  }
  local_834 = 0;
  local_848 = (CTX->illegal_callback).fn;
  local_840 = (CTX->illegal_callback).data;
  secp256k1_context_set_illegal_callback
            (in_stack_ffffffffffffb180,
             (_func_void_char_ptr_void_ptr *)
             CONCAT44(in_stack_ffffffffffffb17c,in_stack_ffffffffffffb178),(void *)0x146910);
  iVar2 = secp256k1_ecdsa_sign
                    (in_stack_ffffffffffffb1f8,in_stack_ffffffffffffb1f0,
                     (uchar *)in_stack_ffffffffffffb1e8,in_stack_ffffffffffffb1e0,
                     in_stack_ffffffffffffb1d8,in_stack_ffffffffffffb1d0);
  psVar1 = CTX;
  if (iVar2 != 0) {
    fprintf(_stderr,"%s:%d: %s\n",
            "/workspace/llm4binary/github/license_c_cmakelists/bitcoin[P]bitcoin/src/secp256k1/src/tests.c"
            ,0x1c56,
            "test condition failed: (secp256k1_ecdsa_sign(CTX, &sig, ((void*)0), key, precomputed_nonce_function, nonce2)) == 0"
           );
    abort();
  }
  (CTX->illegal_callback).fn = local_848;
  (psVar1->illegal_callback).data = local_840;
  if (local_834 != 1) {
    fprintf(_stderr,"%s:%d: %s\n",
            "/workspace/llm4binary/github/license_c_cmakelists/bitcoin[P]bitcoin/src/secp256k1/src/tests.c"
            ,0x1c56,"test condition failed: _calls_to_callback == 1");
    abort();
  }
  local_84c = 0;
  local_860 = (CTX->illegal_callback).fn;
  local_858 = (CTX->illegal_callback).data;
  secp256k1_context_set_illegal_callback
            (in_stack_ffffffffffffb180,
             (_func_void_char_ptr_void_ptr *)
             CONCAT44(in_stack_ffffffffffffb17c,in_stack_ffffffffffffb178),(void *)0x146a49);
  iVar2 = secp256k1_ecdsa_sign
                    (in_stack_ffffffffffffb1f8,in_stack_ffffffffffffb1f0,
                     (uchar *)in_stack_ffffffffffffb1e8,in_stack_ffffffffffffb1e0,
                     in_stack_ffffffffffffb1d8,in_stack_ffffffffffffb1d0);
  psVar1 = CTX;
  if (iVar2 != 0) {
    fprintf(_stderr,"%s:%d: %s\n",
            "/workspace/llm4binary/github/license_c_cmakelists/bitcoin[P]bitcoin/src/secp256k1/src/tests.c"
            ,0x1c57,
            "test condition failed: (secp256k1_ecdsa_sign(CTX, &sig, msg, ((void*)0), precomputed_nonce_function, nonce2)) == 0"
           );
    abort();
  }
  (CTX->illegal_callback).fn = local_860;
  (psVar1->illegal_callback).data = local_858;
  if (local_84c != 1) {
    fprintf(_stderr,"%s:%d: %s\n",
            "/workspace/llm4binary/github/license_c_cmakelists/bitcoin[P]bitcoin/src/secp256k1/src/tests.c"
            ,0x1c57,"test condition failed: _calls_to_callback == 1");
    abort();
  }
  iVar2 = secp256k1_ecdsa_sign
                    (in_stack_ffffffffffffb1f8,in_stack_ffffffffffffb1f0,
                     (uchar *)in_stack_ffffffffffffb1e8,in_stack_ffffffffffffb1e0,
                     in_stack_ffffffffffffb1d8,in_stack_ffffffffffffb1d0);
  if (iVar2 != 1) {
    fprintf(_stderr,"%s:%d: %s\n",
            "/workspace/llm4binary/github/license_c_cmakelists/bitcoin[P]bitcoin/src/secp256k1/src/tests.c"
            ,0x1c58,
            "test condition failed: secp256k1_ecdsa_sign(CTX, &sig, msg, key, precomputed_nonce_function, nonce2) == 1"
           );
    abort();
  }
  iVar2 = secp256k1_ec_pubkey_create
                    (in_stack_ffffffffffffb208,in_stack_ffffffffffffb200,
                     (uchar *)in_stack_ffffffffffffb1f8);
  if (iVar2 != 1) {
    fprintf(_stderr,"%s:%d: %s\n",
            "/workspace/llm4binary/github/license_c_cmakelists/bitcoin[P]bitcoin/src/secp256k1/src/tests.c"
            ,0x1c59,"test condition failed: secp256k1_ec_pubkey_create(CTX, &pubkey, key) == 1");
    abort();
  }
  local_864 = 0;
  local_878 = (CTX->illegal_callback).fn;
  local_870 = (CTX->illegal_callback).data;
  secp256k1_context_set_illegal_callback
            (in_stack_ffffffffffffb180,
             (_func_void_char_ptr_void_ptr *)
             CONCAT44(in_stack_ffffffffffffb17c,in_stack_ffffffffffffb178),(void *)0x146c66);
  iVar2 = secp256k1_ecdsa_verify
                    (in_stack_ffffffffffffb248,in_stack_ffffffffffffb240,in_stack_ffffffffffffb238,
                     in_stack_ffffffffffffb230);
  psVar1 = CTX;
  if (iVar2 != 0) {
    fprintf(_stderr,"%s:%d: %s\n",
            "/workspace/llm4binary/github/license_c_cmakelists/bitcoin[P]bitcoin/src/secp256k1/src/tests.c"
            ,0x1c5a,
            "test condition failed: (secp256k1_ecdsa_verify(CTX, ((void*)0), msg, &pubkey)) == 0");
    abort();
  }
  (CTX->illegal_callback).fn = local_878;
  (psVar1->illegal_callback).data = local_870;
  if (local_864 != 1) {
    fprintf(_stderr,"%s:%d: %s\n",
            "/workspace/llm4binary/github/license_c_cmakelists/bitcoin[P]bitcoin/src/secp256k1/src/tests.c"
            ,0x1c5a,"test condition failed: _calls_to_callback == 1");
    abort();
  }
  local_87c = 0;
  local_890 = (CTX->illegal_callback).fn;
  local_888 = (CTX->illegal_callback).data;
  secp256k1_context_set_illegal_callback
            (in_stack_ffffffffffffb180,
             (_func_void_char_ptr_void_ptr *)
             CONCAT44(in_stack_ffffffffffffb17c,in_stack_ffffffffffffb178),(void *)0x146d91);
  iVar2 = secp256k1_ecdsa_verify
                    (in_stack_ffffffffffffb248,in_stack_ffffffffffffb240,in_stack_ffffffffffffb238,
                     in_stack_ffffffffffffb230);
  psVar1 = CTX;
  if (iVar2 != 0) {
    fprintf(_stderr,"%s:%d: %s\n",
            "/workspace/llm4binary/github/license_c_cmakelists/bitcoin[P]bitcoin/src/secp256k1/src/tests.c"
            ,0x1c5b,
            "test condition failed: (secp256k1_ecdsa_verify(CTX, &sig, ((void*)0), &pubkey)) == 0");
    abort();
  }
  (CTX->illegal_callback).fn = local_890;
  (psVar1->illegal_callback).data = local_888;
  if (local_87c != 1) {
    fprintf(_stderr,"%s:%d: %s\n",
            "/workspace/llm4binary/github/license_c_cmakelists/bitcoin[P]bitcoin/src/secp256k1/src/tests.c"
            ,0x1c5b,"test condition failed: _calls_to_callback == 1");
    abort();
  }
  local_894 = 0;
  local_8a8 = (CTX->illegal_callback).fn;
  local_8a0 = (CTX->illegal_callback).data;
  secp256k1_context_set_illegal_callback
            (in_stack_ffffffffffffb180,
             (_func_void_char_ptr_void_ptr *)
             CONCAT44(in_stack_ffffffffffffb17c,in_stack_ffffffffffffb178),(void *)0x146ebc);
  iVar2 = secp256k1_ecdsa_verify
                    (in_stack_ffffffffffffb248,in_stack_ffffffffffffb240,in_stack_ffffffffffffb238,
                     in_stack_ffffffffffffb230);
  psVar1 = CTX;
  if (iVar2 != 0) {
    fprintf(_stderr,"%s:%d: %s\n",
            "/workspace/llm4binary/github/license_c_cmakelists/bitcoin[P]bitcoin/src/secp256k1/src/tests.c"
            ,0x1c5c,
            "test condition failed: (secp256k1_ecdsa_verify(CTX, &sig, msg, ((void*)0))) == 0");
    abort();
  }
  (CTX->illegal_callback).fn = local_8a8;
  (psVar1->illegal_callback).data = local_8a0;
  if (local_894 != 1) {
    fprintf(_stderr,"%s:%d: %s\n",
            "/workspace/llm4binary/github/license_c_cmakelists/bitcoin[P]bitcoin/src/secp256k1/src/tests.c"
            ,0x1c5c,"test condition failed: _calls_to_callback == 1");
    abort();
  }
  iVar2 = secp256k1_ecdsa_verify
                    (in_stack_ffffffffffffb248,in_stack_ffffffffffffb240,in_stack_ffffffffffffb238,
                     in_stack_ffffffffffffb230);
  if (iVar2 != 1) {
    fprintf(_stderr,"%s:%d: %s\n",
            "/workspace/llm4binary/github/license_c_cmakelists/bitcoin[P]bitcoin/src/secp256k1/src/tests.c"
            ,0x1c5d,"test condition failed: secp256k1_ecdsa_verify(CTX, &sig, msg, &pubkey) == 1");
    abort();
  }
  local_8ac = 0;
  local_8c0 = (CTX->illegal_callback).fn;
  local_8b8 = (CTX->illegal_callback).data;
  secp256k1_context_set_illegal_callback
            (in_stack_ffffffffffffb180,
             (_func_void_char_ptr_void_ptr *)
             CONCAT44(in_stack_ffffffffffffb17c,in_stack_ffffffffffffb178),(void *)0x147056);
  iVar2 = secp256k1_ec_pubkey_create
                    (in_stack_ffffffffffffb208,in_stack_ffffffffffffb200,
                     (uchar *)in_stack_ffffffffffffb1f8);
  psVar1 = CTX;
  if (iVar2 != 0) {
    fprintf(_stderr,"%s:%d: %s\n",
            "/workspace/llm4binary/github/license_c_cmakelists/bitcoin[P]bitcoin/src/secp256k1/src/tests.c"
            ,0x1c5e,
            "test condition failed: (secp256k1_ec_pubkey_create(CTX, &pubkey, ((void*)0))) == 0");
    abort();
  }
  (CTX->illegal_callback).fn = local_8c0;
  (psVar1->illegal_callback).data = local_8b8;
  if (local_8ac != 1) {
    fprintf(_stderr,"%s:%d: %s\n",
            "/workspace/llm4binary/github/license_c_cmakelists/bitcoin[P]bitcoin/src/secp256k1/src/tests.c"
            ,0x1c5e,"test condition failed: _calls_to_callback == 1");
    abort();
  }
  local_8c4 = 0;
  local_8d8 = (CTX->illegal_callback).fn;
  local_8d0 = (CTX->illegal_callback).data;
  secp256k1_context_set_illegal_callback
            (in_stack_ffffffffffffb180,
             (_func_void_char_ptr_void_ptr *)
             CONCAT44(in_stack_ffffffffffffb17c,in_stack_ffffffffffffb178),(void *)0x147179);
  iVar2 = secp256k1_ecdsa_verify
                    (in_stack_ffffffffffffb248,in_stack_ffffffffffffb240,in_stack_ffffffffffffb238,
                     in_stack_ffffffffffffb230);
  psVar1 = CTX;
  if (iVar2 != 0) {
    fprintf(_stderr,"%s:%d: %s\n",
            "/workspace/llm4binary/github/license_c_cmakelists/bitcoin[P]bitcoin/src/secp256k1/src/tests.c"
            ,0x1c60,"test condition failed: (secp256k1_ecdsa_verify(CTX, &sig, msg, &pubkey)) == 0")
    ;
    abort();
  }
  (CTX->illegal_callback).fn = local_8d8;
  (psVar1->illegal_callback).data = local_8d0;
  if (local_8c4 != 1) {
    fprintf(_stderr,"%s:%d: %s\n",
            "/workspace/llm4binary/github/license_c_cmakelists/bitcoin[P]bitcoin/src/secp256k1/src/tests.c"
            ,0x1c60,"test condition failed: _calls_to_callback == 1");
    abort();
  }
  local_788 = 0x48;
  local_8dc = 0;
  local_8f0 = (CTX->illegal_callback).fn;
  local_8e8 = (CTX->illegal_callback).data;
  secp256k1_context_set_illegal_callback
            (in_stack_ffffffffffffb180,
             (_func_void_char_ptr_void_ptr *)
             CONCAT44(in_stack_ffffffffffffb17c,in_stack_ffffffffffffb178),(void *)0x1472b2);
  iVar2 = secp256k1_ecdsa_signature_serialize_der
                    ((secp256k1_context *)
                     CONCAT44(in_stack_ffffffffffffb1cc,in_stack_ffffffffffffb1c8),
                     in_stack_ffffffffffffb1c0->data,(size_t *)in_stack_ffffffffffffb1b8,
                     in_stack_ffffffffffffb1b0);
  psVar1 = CTX;
  if (iVar2 != 0) {
    fprintf(_stderr,"%s:%d: %s\n",
            "/workspace/llm4binary/github/license_c_cmakelists/bitcoin[P]bitcoin/src/secp256k1/src/tests.c"
            ,0x1c62,
            "test condition failed: (secp256k1_ecdsa_signature_serialize_der(CTX, ((void*)0), &siglen, &sig)) == 0"
           );
    abort();
  }
  (CTX->illegal_callback).fn = local_8f0;
  (psVar1->illegal_callback).data = local_8e8;
  if (local_8dc != 1) {
    fprintf(_stderr,"%s:%d: %s\n",
            "/workspace/llm4binary/github/license_c_cmakelists/bitcoin[P]bitcoin/src/secp256k1/src/tests.c"
            ,0x1c62,"test condition failed: _calls_to_callback == 1");
    abort();
  }
  local_8f4 = 0;
  local_908 = (CTX->illegal_callback).fn;
  local_900 = (CTX->illegal_callback).data;
  secp256k1_context_set_illegal_callback
            (in_stack_ffffffffffffb180,
             (_func_void_char_ptr_void_ptr *)
             CONCAT44(in_stack_ffffffffffffb17c,in_stack_ffffffffffffb178),(void *)0x1473dd);
  iVar2 = secp256k1_ecdsa_signature_serialize_der
                    ((secp256k1_context *)
                     CONCAT44(in_stack_ffffffffffffb1cc,in_stack_ffffffffffffb1c8),
                     in_stack_ffffffffffffb1c0->data,(size_t *)in_stack_ffffffffffffb1b8,
                     in_stack_ffffffffffffb1b0);
  psVar1 = CTX;
  if (iVar2 != 0) {
    fprintf(_stderr,"%s:%d: %s\n",
            "/workspace/llm4binary/github/license_c_cmakelists/bitcoin[P]bitcoin/src/secp256k1/src/tests.c"
            ,0x1c63,
            "test condition failed: (secp256k1_ecdsa_signature_serialize_der(CTX, signature, ((void*)0), &sig)) == 0"
           );
    abort();
  }
  (CTX->illegal_callback).fn = local_908;
  (psVar1->illegal_callback).data = local_900;
  if (local_8f4 != 1) {
    fprintf(_stderr,"%s:%d: %s\n",
            "/workspace/llm4binary/github/license_c_cmakelists/bitcoin[P]bitcoin/src/secp256k1/src/tests.c"
            ,0x1c63,"test condition failed: _calls_to_callback == 1");
    abort();
  }
  local_90c = 0;
  local_920 = (CTX->illegal_callback).fn;
  local_918 = (CTX->illegal_callback).data;
  secp256k1_context_set_illegal_callback
            (in_stack_ffffffffffffb180,
             (_func_void_char_ptr_void_ptr *)
             CONCAT44(in_stack_ffffffffffffb17c,in_stack_ffffffffffffb178),(void *)0x147508);
  iVar2 = secp256k1_ecdsa_signature_serialize_der
                    ((secp256k1_context *)
                     CONCAT44(in_stack_ffffffffffffb1cc,in_stack_ffffffffffffb1c8),
                     in_stack_ffffffffffffb1c0->data,(size_t *)in_stack_ffffffffffffb1b8,
                     in_stack_ffffffffffffb1b0);
  psVar1 = CTX;
  if (iVar2 != 0) {
    fprintf(_stderr,"%s:%d: %s\n",
            "/workspace/llm4binary/github/license_c_cmakelists/bitcoin[P]bitcoin/src/secp256k1/src/tests.c"
            ,0x1c64,
            "test condition failed: (secp256k1_ecdsa_signature_serialize_der(CTX, signature, &siglen, ((void*)0))) == 0"
           );
    abort();
  }
  (CTX->illegal_callback).fn = local_920;
  (psVar1->illegal_callback).data = local_918;
  if (local_90c != 1) {
    fprintf(_stderr,"%s:%d: %s\n",
            "/workspace/llm4binary/github/license_c_cmakelists/bitcoin[P]bitcoin/src/secp256k1/src/tests.c"
            ,0x1c64,"test condition failed: _calls_to_callback == 1");
    abort();
  }
  iVar2 = secp256k1_ecdsa_signature_serialize_der
                    ((secp256k1_context *)
                     CONCAT44(in_stack_ffffffffffffb1cc,in_stack_ffffffffffffb1c8),
                     in_stack_ffffffffffffb1c0->data,(size_t *)in_stack_ffffffffffffb1b8,
                     in_stack_ffffffffffffb1b0);
  if (iVar2 != 1) {
    fprintf(_stderr,"%s:%d: %s\n",
            "/workspace/llm4binary/github/license_c_cmakelists/bitcoin[P]bitcoin/src/secp256k1/src/tests.c"
            ,0x1c65,
            "test condition failed: secp256k1_ecdsa_signature_serialize_der(CTX, signature, &siglen, &sig) == 1"
           );
    abort();
  }
  local_924 = 0;
  local_938 = (CTX->illegal_callback).fn;
  local_930 = (CTX->illegal_callback).data;
  secp256k1_context_set_illegal_callback
            (in_stack_ffffffffffffb180,
             (_func_void_char_ptr_void_ptr *)
             CONCAT44(in_stack_ffffffffffffb17c,in_stack_ffffffffffffb178),(void *)0x1476a2);
  iVar2 = secp256k1_ecdsa_signature_parse_der
                    ((secp256k1_context *)
                     CONCAT44(in_stack_ffffffffffffb1cc,in_stack_ffffffffffffb1c8),
                     in_stack_ffffffffffffb1c0,in_stack_ffffffffffffb1b8->data,
                     (size_t)in_stack_ffffffffffffb1b0);
  psVar1 = CTX;
  if (iVar2 != 0) {
    fprintf(_stderr,"%s:%d: %s\n",
            "/workspace/llm4binary/github/license_c_cmakelists/bitcoin[P]bitcoin/src/secp256k1/src/tests.c"
            ,0x1c66,
            "test condition failed: (secp256k1_ecdsa_signature_parse_der(CTX, ((void*)0), signature, siglen)) == 0"
           );
    abort();
  }
  (CTX->illegal_callback).fn = local_938;
  (psVar1->illegal_callback).data = local_930;
  if (local_924 != 1) {
    fprintf(_stderr,"%s:%d: %s\n",
            "/workspace/llm4binary/github/license_c_cmakelists/bitcoin[P]bitcoin/src/secp256k1/src/tests.c"
            ,0x1c66,"test condition failed: _calls_to_callback == 1");
    abort();
  }
  local_93c = 0;
  local_950 = (CTX->illegal_callback).fn;
  local_948 = (CTX->illegal_callback).data;
  secp256k1_context_set_illegal_callback
            (in_stack_ffffffffffffb180,
             (_func_void_char_ptr_void_ptr *)
             CONCAT44(in_stack_ffffffffffffb17c,in_stack_ffffffffffffb178),(void *)0x1477cd);
  iVar2 = secp256k1_ecdsa_signature_parse_der
                    ((secp256k1_context *)
                     CONCAT44(in_stack_ffffffffffffb1cc,in_stack_ffffffffffffb1c8),
                     in_stack_ffffffffffffb1c0,in_stack_ffffffffffffb1b8->data,
                     (size_t)in_stack_ffffffffffffb1b0);
  psVar1 = CTX;
  if (iVar2 != 0) {
    fprintf(_stderr,"%s:%d: %s\n",
            "/workspace/llm4binary/github/license_c_cmakelists/bitcoin[P]bitcoin/src/secp256k1/src/tests.c"
            ,0x1c67,
            "test condition failed: (secp256k1_ecdsa_signature_parse_der(CTX, &sig, ((void*)0), siglen)) == 0"
           );
    abort();
  }
  (CTX->illegal_callback).fn = local_950;
  (psVar1->illegal_callback).data = local_948;
  if (local_93c != 1) {
    fprintf(_stderr,"%s:%d: %s\n",
            "/workspace/llm4binary/github/license_c_cmakelists/bitcoin[P]bitcoin/src/secp256k1/src/tests.c"
            ,0x1c67,"test condition failed: _calls_to_callback == 1");
    abort();
  }
  iVar2 = secp256k1_ecdsa_signature_parse_der
                    ((secp256k1_context *)
                     CONCAT44(in_stack_ffffffffffffb1cc,in_stack_ffffffffffffb1c8),
                     in_stack_ffffffffffffb1c0,in_stack_ffffffffffffb1b8->data,
                     (size_t)in_stack_ffffffffffffb1b0);
  if (iVar2 != 1) {
    fprintf(_stderr,"%s:%d: %s\n",
            "/workspace/llm4binary/github/license_c_cmakelists/bitcoin[P]bitcoin/src/secp256k1/src/tests.c"
            ,0x1c68,
            "test condition failed: secp256k1_ecdsa_signature_parse_der(CTX, &sig, signature, siglen) == 1"
           );
    abort();
  }
  local_788 = 10;
  iVar2 = secp256k1_ecdsa_signature_serialize_der
                    ((secp256k1_context *)
                     CONCAT44(in_stack_ffffffffffffb1cc,in_stack_ffffffffffffb1c8),
                     in_stack_ffffffffffffb1c0->data,(size_t *)in_stack_ffffffffffffb1b8,
                     in_stack_ffffffffffffb1b0);
  if (iVar2 != 0) {
    fprintf(_stderr,"%s:%d: %s\n",
            "/workspace/llm4binary/github/license_c_cmakelists/bitcoin[P]bitcoin/src/secp256k1/src/tests.c"
            ,0x1c6b,
            "test condition failed: secp256k1_ecdsa_signature_serialize_der(CTX, signature, &siglen, &sig) == 0"
           );
    abort();
  }
  local_954 = 0;
  local_968 = (CTX->illegal_callback).fn;
  local_960 = (CTX->illegal_callback).data;
  secp256k1_context_set_illegal_callback
            (in_stack_ffffffffffffb180,
             (_func_void_char_ptr_void_ptr *)
             CONCAT44(in_stack_ffffffffffffb17c,in_stack_ffffffffffffb178),(void *)0x1479e0);
  iVar2 = secp256k1_ecdsa_signature_normalize
                    ((secp256k1_context *)
                     CONCAT44(in_stack_ffffffffffffb1cc,in_stack_ffffffffffffb1c8),
                     in_stack_ffffffffffffb1c0,in_stack_ffffffffffffb1b8);
  psVar1 = CTX;
  if (iVar2 != 0) {
    fprintf(_stderr,"%s:%d: %s\n",
            "/workspace/llm4binary/github/license_c_cmakelists/bitcoin[P]bitcoin/src/secp256k1/src/tests.c"
            ,0x1c6c,
            "test condition failed: (secp256k1_ecdsa_signature_normalize(CTX, ((void*)0), ((void*)0))) == 0"
           );
    abort();
  }
  (CTX->illegal_callback).fn = local_968;
  (psVar1->illegal_callback).data = local_960;
  if (local_954 != 1) {
    fprintf(_stderr,"%s:%d: %s\n",
            "/workspace/llm4binary/github/license_c_cmakelists/bitcoin[P]bitcoin/src/secp256k1/src/tests.c"
            ,0x1c6c,"test condition failed: _calls_to_callback == 1");
    abort();
  }
  local_96c = 0;
  local_980 = (CTX->illegal_callback).fn;
  local_978 = (CTX->illegal_callback).data;
  secp256k1_context_set_illegal_callback
            (in_stack_ffffffffffffb180,
             (_func_void_char_ptr_void_ptr *)
             CONCAT44(in_stack_ffffffffffffb17c,in_stack_ffffffffffffb178),(void *)0x147afe);
  iVar2 = secp256k1_ecdsa_signature_serialize_compact
                    ((secp256k1_context *)
                     CONCAT44(in_stack_ffffffffffffb1cc,in_stack_ffffffffffffb1c8),
                     in_stack_ffffffffffffb1c0->data,in_stack_ffffffffffffb1b8);
  psVar1 = CTX;
  if (iVar2 != 0) {
    fprintf(_stderr,"%s:%d: %s\n",
            "/workspace/llm4binary/github/license_c_cmakelists/bitcoin[P]bitcoin/src/secp256k1/src/tests.c"
            ,0x1c6d,
            "test condition failed: (secp256k1_ecdsa_signature_serialize_compact(CTX, ((void*)0), &sig)) == 0"
           );
    abort();
  }
  (CTX->illegal_callback).fn = local_980;
  (psVar1->illegal_callback).data = local_978;
  if (local_96c != 1) {
    fprintf(_stderr,"%s:%d: %s\n",
            "/workspace/llm4binary/github/license_c_cmakelists/bitcoin[P]bitcoin/src/secp256k1/src/tests.c"
            ,0x1c6d,"test condition failed: _calls_to_callback == 1");
    abort();
  }
  local_984 = 0;
  local_998 = (CTX->illegal_callback).fn;
  local_990 = (CTX->illegal_callback).data;
  secp256k1_context_set_illegal_callback
            (in_stack_ffffffffffffb180,
             (_func_void_char_ptr_void_ptr *)
             CONCAT44(in_stack_ffffffffffffb17c,in_stack_ffffffffffffb178),(void *)0x147c21);
  iVar2 = secp256k1_ecdsa_signature_serialize_compact
                    ((secp256k1_context *)
                     CONCAT44(in_stack_ffffffffffffb1cc,in_stack_ffffffffffffb1c8),
                     in_stack_ffffffffffffb1c0->data,in_stack_ffffffffffffb1b8);
  psVar1 = CTX;
  if (iVar2 != 0) {
    fprintf(_stderr,"%s:%d: %s\n",
            "/workspace/llm4binary/github/license_c_cmakelists/bitcoin[P]bitcoin/src/secp256k1/src/tests.c"
            ,0x1c6e,
            "test condition failed: (secp256k1_ecdsa_signature_serialize_compact(CTX, signature, ((void*)0))) == 0"
           );
    abort();
  }
  (CTX->illegal_callback).fn = local_998;
  (psVar1->illegal_callback).data = local_990;
  if (local_984 != 1) {
    fprintf(_stderr,"%s:%d: %s\n",
            "/workspace/llm4binary/github/license_c_cmakelists/bitcoin[P]bitcoin/src/secp256k1/src/tests.c"
            ,0x1c6e,"test condition failed: _calls_to_callback == 1");
    abort();
  }
  iVar2 = secp256k1_ecdsa_signature_serialize_compact
                    ((secp256k1_context *)
                     CONCAT44(in_stack_ffffffffffffb1cc,in_stack_ffffffffffffb1c8),
                     in_stack_ffffffffffffb1c0->data,in_stack_ffffffffffffb1b8);
  if (iVar2 != 1) {
    fprintf(_stderr,"%s:%d: %s\n",
            "/workspace/llm4binary/github/license_c_cmakelists/bitcoin[P]bitcoin/src/secp256k1/src/tests.c"
            ,0x1c6f,
            "test condition failed: secp256k1_ecdsa_signature_serialize_compact(CTX, signature, &sig) == 1"
           );
    abort();
  }
  local_99c = 0;
  local_9b0 = (CTX->illegal_callback).fn;
  local_9a8 = (CTX->illegal_callback).data;
  secp256k1_context_set_illegal_callback
            (in_stack_ffffffffffffb180,
             (_func_void_char_ptr_void_ptr *)
             CONCAT44(in_stack_ffffffffffffb17c,in_stack_ffffffffffffb178),(void *)0x147dab);
  iVar2 = secp256k1_ecdsa_signature_parse_compact
                    ((secp256k1_context *)
                     CONCAT44(in_stack_ffffffffffffb1cc,in_stack_ffffffffffffb1c8),
                     in_stack_ffffffffffffb1c0,in_stack_ffffffffffffb1b8->data);
  psVar1 = CTX;
  if (iVar2 != 0) {
    fprintf(_stderr,"%s:%d: %s\n",
            "/workspace/llm4binary/github/license_c_cmakelists/bitcoin[P]bitcoin/src/secp256k1/src/tests.c"
            ,0x1c70,
            "test condition failed: (secp256k1_ecdsa_signature_parse_compact(CTX, ((void*)0), signature)) == 0"
           );
    abort();
  }
  (CTX->illegal_callback).fn = local_9b0;
  (psVar1->illegal_callback).data = local_9a8;
  if (local_99c != 1) {
    fprintf(_stderr,"%s:%d: %s\n",
            "/workspace/llm4binary/github/license_c_cmakelists/bitcoin[P]bitcoin/src/secp256k1/src/tests.c"
            ,0x1c70,"test condition failed: _calls_to_callback == 1");
    abort();
  }
  local_9b4 = 0;
  local_9c8 = (CTX->illegal_callback).fn;
  local_9c0 = (CTX->illegal_callback).data;
  secp256k1_context_set_illegal_callback
            (in_stack_ffffffffffffb180,
             (_func_void_char_ptr_void_ptr *)
             CONCAT44(in_stack_ffffffffffffb17c,in_stack_ffffffffffffb178),(void *)0x147ece);
  iVar2 = secp256k1_ecdsa_signature_parse_compact
                    ((secp256k1_context *)
                     CONCAT44(in_stack_ffffffffffffb1cc,in_stack_ffffffffffffb1c8),
                     in_stack_ffffffffffffb1c0,in_stack_ffffffffffffb1b8->data);
  psVar1 = CTX;
  if (iVar2 != 0) {
    fprintf(_stderr,"%s:%d: %s\n",
            "/workspace/llm4binary/github/license_c_cmakelists/bitcoin[P]bitcoin/src/secp256k1/src/tests.c"
            ,0x1c71,
            "test condition failed: (secp256k1_ecdsa_signature_parse_compact(CTX, &sig, ((void*)0))) == 0"
           );
    abort();
  }
  (CTX->illegal_callback).fn = local_9c8;
  (psVar1->illegal_callback).data = local_9c0;
  if (local_9b4 != 1) {
    fprintf(_stderr,"%s:%d: %s\n",
            "/workspace/llm4binary/github/license_c_cmakelists/bitcoin[P]bitcoin/src/secp256k1/src/tests.c"
            ,0x1c71,"test condition failed: _calls_to_callback == 1");
    abort();
  }
  iVar2 = secp256k1_ecdsa_signature_parse_compact
                    ((secp256k1_context *)
                     CONCAT44(in_stack_ffffffffffffb1cc,in_stack_ffffffffffffb1c8),
                     in_stack_ffffffffffffb1c0,in_stack_ffffffffffffb1b8->data);
  if (iVar2 != 1) {
    fprintf(_stderr,"%s:%d: %s\n",
            "/workspace/llm4binary/github/license_c_cmakelists/bitcoin[P]bitcoin/src/secp256k1/src/tests.c"
            ,0x1c72,
            "test condition failed: secp256k1_ecdsa_signature_parse_compact(CTX, &sig, signature) == 1"
           );
    abort();
  }
  memset(local_7d8,0xff,0x40);
  iVar2 = secp256k1_ecdsa_signature_parse_compact
                    ((secp256k1_context *)
                     CONCAT44(in_stack_ffffffffffffb1cc,in_stack_ffffffffffffb1c8),
                     in_stack_ffffffffffffb1c0,in_stack_ffffffffffffb1b8->data);
  if (iVar2 != 0) {
    fprintf(_stderr,"%s:%d: %s\n",
            "/workspace/llm4binary/github/license_c_cmakelists/bitcoin[P]bitcoin/src/secp256k1/src/tests.c"
            ,0x1c74,
            "test condition failed: secp256k1_ecdsa_signature_parse_compact(CTX, &sig, signature) == 0"
           );
    abort();
  }
  for (local_4 = 0; local_4 < 2; local_4 = local_4 + 1) {
    local_4a80 = "";
    if (local_4 == 0) {
      local_4a80 = (uchar *)0x0;
    }
    memset(local_a18,0,0x20);
    local_9f9 = 1;
    memset(local_9f8,0xff,0x20);
    iVar2 = secp256k1_ecdsa_sign
                      (in_stack_ffffffffffffb1f8,in_stack_ffffffffffffb1f0,
                       (uchar *)in_stack_ffffffffffffb1e8,in_stack_ffffffffffffb1e0,
                       in_stack_ffffffffffffb1d8,in_stack_ffffffffffffb1d0);
    if (iVar2 != 0) {
      fprintf(_stderr,"%s:%d: %s\n",
              "/workspace/llm4binary/github/license_c_cmakelists/bitcoin[P]bitcoin/src/secp256k1/src/tests.c"
              ,0x1c85,
              "test condition failed: secp256k1_ecdsa_sign(CTX, &sig, msg, key, NULL, extra) == 0");
      abort();
    }
    iVar2 = is_empty_signature((secp256k1_ecdsa_signature *)0x14817b);
    if (iVar2 == 0) {
      fprintf(_stderr,"%s:%d: %s\n",
              "/workspace/llm4binary/github/license_c_cmakelists/bitcoin[P]bitcoin/src/secp256k1/src/tests.c"
              ,0x1c86,"test condition failed: is_empty_signature(&sig)");
      abort();
    }
    memset(local_9f8,0,0x20);
    iVar2 = secp256k1_ecdsa_sign
                      (in_stack_ffffffffffffb1f8,in_stack_ffffffffffffb1f0,
                       (uchar *)in_stack_ffffffffffffb1e8,in_stack_ffffffffffffb1e0,
                       in_stack_ffffffffffffb1d8,in_stack_ffffffffffffb1d0);
    if (iVar2 != 0) {
      fprintf(_stderr,"%s:%d: %s\n",
              "/workspace/llm4binary/github/license_c_cmakelists/bitcoin[P]bitcoin/src/secp256k1/src/tests.c"
              ,0x1c89,
              "test condition failed: secp256k1_ecdsa_sign(CTX, &sig, msg, key, NULL, extra) == 0");
      abort();
    }
    iVar2 = is_empty_signature((secp256k1_ecdsa_signature *)0x148261);
    if (iVar2 == 0) {
      fprintf(_stderr,"%s:%d: %s\n",
              "/workspace/llm4binary/github/license_c_cmakelists/bitcoin[P]bitcoin/src/secp256k1/src/tests.c"
              ,0x1c8a,"test condition failed: is_empty_signature(&sig)");
      abort();
    }
    local_9d9 = 1;
    iVar2 = secp256k1_ecdsa_sign
                      (in_stack_ffffffffffffb1f8,in_stack_ffffffffffffb1f0,
                       (uchar *)in_stack_ffffffffffffb1e8,in_stack_ffffffffffffb1e0,
                       in_stack_ffffffffffffb1d8,in_stack_ffffffffffffb1d0);
    if (iVar2 != 0) {
      fprintf(_stderr,"%s:%d: %s\n",
              "/workspace/llm4binary/github/license_c_cmakelists/bitcoin[P]bitcoin/src/secp256k1/src/tests.c"
              ,0x1c8d,
              "test condition failed: secp256k1_ecdsa_sign(CTX, &sig, msg, key, nonce_function_test_fail, extra) == 0"
             );
      abort();
    }
    iVar2 = is_empty_signature((secp256k1_ecdsa_signature *)0x14833d);
    if (iVar2 == 0) {
      fprintf(_stderr,"%s:%d: %s\n",
              "/workspace/llm4binary/github/license_c_cmakelists/bitcoin[P]bitcoin/src/secp256k1/src/tests.c"
              ,0x1c8e,"test condition failed: is_empty_signature(&sig)");
      abort();
    }
    iVar2 = secp256k1_ecdsa_sign
                      (in_stack_ffffffffffffb1f8,in_stack_ffffffffffffb1f0,
                       (uchar *)in_stack_ffffffffffffb1e8,in_stack_ffffffffffffb1e0,
                       in_stack_ffffffffffffb1d8,in_stack_ffffffffffffb1d0);
    if (iVar2 != 1) {
      fprintf(_stderr,"%s:%d: %s\n",
              "/workspace/llm4binary/github/license_c_cmakelists/bitcoin[P]bitcoin/src/secp256k1/src/tests.c"
              ,0x1c90,
              "test condition failed: secp256k1_ecdsa_sign(CTX, &sig, msg, key, nonce_function_test_retry, extra) == 1"
             );
      abort();
    }
    iVar2 = is_empty_signature((secp256k1_ecdsa_signature *)0x148413);
    if (iVar2 != 0) {
      fprintf(_stderr,"%s:%d: %s\n",
              "/workspace/llm4binary/github/license_c_cmakelists/bitcoin[P]bitcoin/src/secp256k1/src/tests.c"
              ,0x1c91,"test condition failed: !is_empty_signature(&sig)");
      abort();
    }
    iVar2 = secp256k1_ecdsa_sign
                      (in_stack_ffffffffffffb1f8,in_stack_ffffffffffffb1f0,
                       (uchar *)in_stack_ffffffffffffb1e8,in_stack_ffffffffffffb1e0,
                       in_stack_ffffffffffffb1d8,in_stack_ffffffffffffb1d0);
    if (iVar2 != 1) {
      fprintf(_stderr,"%s:%d: %s\n",
              "/workspace/llm4binary/github/license_c_cmakelists/bitcoin[P]bitcoin/src/secp256k1/src/tests.c"
              ,0x1c92,
              "test condition failed: secp256k1_ecdsa_sign(CTX, &sig2, msg, key, nonce_function_rfc6979, extra) == 1"
             );
      abort();
    }
    iVar2 = is_empty_signature((secp256k1_ecdsa_signature *)0x1484eb);
    if (iVar2 != 0) {
      fprintf(_stderr,"%s:%d: %s\n",
              "/workspace/llm4binary/github/license_c_cmakelists/bitcoin[P]bitcoin/src/secp256k1/src/tests.c"
              ,0x1c93,"test condition failed: !is_empty_signature(&sig2)");
      abort();
    }
    iVar2 = secp256k1_memcmp_var(local_44,&local_a58,0x40);
    if (iVar2 != 0) {
      fprintf(_stderr,"%s:%d: %s\n",
              "/workspace/llm4binary/github/license_c_cmakelists/bitcoin[P]bitcoin/src/secp256k1/src/tests.c"
              ,0x1c94,"test condition failed: secp256k1_memcmp_var(&sig, &sig2, sizeof(sig)) == 0");
      abort();
    }
    iVar2 = secp256k1_ecdsa_sign
                      (in_stack_ffffffffffffb1f8,in_stack_ffffffffffffb1f0,
                       (uchar *)in_stack_ffffffffffffb1e8,in_stack_ffffffffffffb1e0,
                       in_stack_ffffffffffffb1d8,in_stack_ffffffffffffb1d0);
    if (iVar2 != 1) {
      fprintf(_stderr,"%s:%d: %s\n",
              "/workspace/llm4binary/github/license_c_cmakelists/bitcoin[P]bitcoin/src/secp256k1/src/tests.c"
              ,0x1c96,
              "test condition failed: secp256k1_ecdsa_sign(CTX, &sig2, msg, key, NULL, extra) == 1")
      ;
      abort();
    }
    iVar2 = is_empty_signature((secp256k1_ecdsa_signature *)0x148626);
    if (iVar2 != 0) {
      fprintf(_stderr,"%s:%d: %s\n",
              "/workspace/llm4binary/github/license_c_cmakelists/bitcoin[P]bitcoin/src/secp256k1/src/tests.c"
              ,0x1c97,"test condition failed: !is_empty_signature(&sig2)");
      abort();
    }
    iVar2 = secp256k1_memcmp_var(local_44,&local_a58,0x40);
    if (iVar2 != 0) {
      fprintf(_stderr,"%s:%d: %s\n",
              "/workspace/llm4binary/github/license_c_cmakelists/bitcoin[P]bitcoin/src/secp256k1/src/tests.c"
              ,0x1c98,"test condition failed: secp256k1_memcmp_var(&sig, &sig2, sizeof(sig)) == 0");
      abort();
    }
    for (local_9cc = 0; local_9cc < 0x100; local_9cc = local_9cc + 1) {
      local_a18[0] = (undefined1)local_9cc;
      iVar2 = secp256k1_ecdsa_sign
                        (in_stack_ffffffffffffb1f8,in_stack_ffffffffffffb1f0,
                         (uchar *)in_stack_ffffffffffffb1e8,in_stack_ffffffffffffb1e0,
                         in_stack_ffffffffffffb1d8,in_stack_ffffffffffffb1d0);
      if (iVar2 != 1) {
        fprintf(_stderr,"%s:%d: %s\n",
                "/workspace/llm4binary/github/license_c_cmakelists/bitcoin[P]bitcoin/src/secp256k1/src/tests.c"
                ,0x1c9d,
                "test condition failed: secp256k1_ecdsa_sign(CTX, &sig2, msg, key, NULL, extra) == 1"
               );
        abort();
      }
      iVar2 = is_empty_signature((secp256k1_ecdsa_signature *)0x148789);
      if (iVar2 != 0) {
        fprintf(_stderr,"%s:%d: %s\n",
                "/workspace/llm4binary/github/license_c_cmakelists/bitcoin[P]bitcoin/src/secp256k1/src/tests.c"
                ,0x1c9e,"test condition failed: !is_empty_signature(&sig2)");
        abort();
      }
      secp256k1_ecdsa_signature_load(CTX,local_4a58 + local_9cc,&local_4a78,&local_a58);
      for (local_4a84 = 0; local_4a84 < local_9cc; local_4a84 = local_4a84 + 1) {
        iVar2 = secp256k1_scalar_eq((secp256k1_scalar *)in_stack_ffffffffffffb180,
                                    (secp256k1_scalar *)
                                    CONCAT44(in_stack_ffffffffffffb17c,in_stack_ffffffffffffb178));
        if (iVar2 != 0) {
          fprintf(_stderr,"%s:%d: %s\n",
                  "/workspace/llm4binary/github/license_c_cmakelists/bitcoin[P]bitcoin/src/secp256k1/src/tests.c"
                  ,0x1ca1,"test condition failed: !secp256k1_scalar_eq(&sr[i], &sr[j])");
          abort();
        }
      }
    }
    local_a18[0] = 0;
    local_9f9 = 2;
    for (local_9cc = 0x100; local_9cc < 0x200; local_9cc = local_9cc + 1) {
      local_9f8[0] = (undefined1)local_9cc;
      iVar2 = secp256k1_ecdsa_sign
                        (in_stack_ffffffffffffb1f8,in_stack_ffffffffffffb1f0,
                         (uchar *)in_stack_ffffffffffffb1e8,in_stack_ffffffffffffb1e0,
                         in_stack_ffffffffffffb1d8,in_stack_ffffffffffffb1d0);
      if (iVar2 != 1) {
        fprintf(_stderr,"%s:%d: %s\n",
                "/workspace/llm4binary/github/license_c_cmakelists/bitcoin[P]bitcoin/src/secp256k1/src/tests.c"
                ,0x1caa,
                "test condition failed: secp256k1_ecdsa_sign(CTX, &sig2, msg, key, NULL, extra) == 1"
               );
        abort();
      }
      iVar2 = is_empty_signature((secp256k1_ecdsa_signature *)0x14899e);
      if (iVar2 != 0) {
        fprintf(_stderr,"%s:%d: %s\n",
                "/workspace/llm4binary/github/license_c_cmakelists/bitcoin[P]bitcoin/src/secp256k1/src/tests.c"
                ,0x1cab,"test condition failed: !is_empty_signature(&sig2)");
        abort();
      }
      secp256k1_ecdsa_signature_load(CTX,local_4a58 + local_9cc,&local_4a78,&local_a58);
      for (local_4a88 = 0; local_4a88 < local_9cc; local_4a88 = local_4a88 + 1) {
        iVar2 = secp256k1_scalar_eq((secp256k1_scalar *)in_stack_ffffffffffffb180,
                                    (secp256k1_scalar *)
                                    CONCAT44(in_stack_ffffffffffffb17c,in_stack_ffffffffffffb178));
        if (iVar2 != 0) {
          fprintf(_stderr,"%s:%d: %s\n",
                  "/workspace/llm4binary/github/license_c_cmakelists/bitcoin[P]bitcoin/src/secp256k1/src/tests.c"
                  ,0x1cae,"test condition failed: !secp256k1_scalar_eq(&sr[i], &sr[j])");
          abort();
        }
      }
    }
    local_9f8[0] = 0;
  }
  memset(local_4aa8,0,0x20);
  iVar2 = nonce_function_rfc6979
                    (in_stack_ffffffffffffb2a0,in_stack_ffffffffffffb298,in_stack_ffffffffffffb290,
                     in_stack_ffffffffffffb288,in_stack_ffffffffffffb280,in_stack_ffffffffffffb27c);
  if (iVar2 != 1) {
    fprintf(_stderr,"%s:%d: %s\n",
            "/workspace/llm4binary/github/license_c_cmakelists/bitcoin[P]bitcoin/src/secp256k1/src/tests.c"
            ,0x1cbf,
            "test condition failed: nonce_function_rfc6979(nonce, zeros, zeros, NULL, NULL, 0) == 1"
           );
    abort();
  }
  iVar2 = nonce_function_rfc6979
                    (in_stack_ffffffffffffb2a0,in_stack_ffffffffffffb298,in_stack_ffffffffffffb290,
                     in_stack_ffffffffffffb288,in_stack_ffffffffffffb280,in_stack_ffffffffffffb27c);
  if (iVar2 != 1) {
    fprintf(_stderr,"%s:%d: %s\n",
            "/workspace/llm4binary/github/license_c_cmakelists/bitcoin[P]bitcoin/src/secp256k1/src/tests.c"
            ,0x1cc1,
            "test condition failed: nonce_function_rfc6979(nonce2, zeros, zeros, zeros, NULL, 0) == 1"
           );
    abort();
  }
  iVar2 = nonce_function_rfc6979
                    (in_stack_ffffffffffffb2a0,in_stack_ffffffffffffb298,in_stack_ffffffffffffb290,
                     in_stack_ffffffffffffb288,in_stack_ffffffffffffb280,in_stack_ffffffffffffb27c);
  if (iVar2 != 1) {
    fprintf(_stderr,"%s:%d: %s\n",
            "/workspace/llm4binary/github/license_c_cmakelists/bitcoin[P]bitcoin/src/secp256k1/src/tests.c"
            ,0x1cc3,
            "test condition failed: nonce_function_rfc6979(nonce3, zeros, zeros, NULL, (void *)zeros, 0) == 1"
           );
    abort();
  }
  iVar2 = nonce_function_rfc6979
                    (in_stack_ffffffffffffb2a0,in_stack_ffffffffffffb298,in_stack_ffffffffffffb290,
                     in_stack_ffffffffffffb288,in_stack_ffffffffffffb280,in_stack_ffffffffffffb27c);
  if (iVar2 != 1) {
    fprintf(_stderr,"%s:%d: %s\n",
            "/workspace/llm4binary/github/license_c_cmakelists/bitcoin[P]bitcoin/src/secp256k1/src/tests.c"
            ,0x1cc5,
            "test condition failed: nonce_function_rfc6979(nonce4, zeros, zeros, zeros, (void *)zeros, 0) == 1"
           );
    abort();
  }
  iVar2 = secp256k1_memcmp_var(local_4ac8,local_4ae8,0x20);
  if (iVar2 == 0) {
    fprintf(_stderr,"%s:%d: %s\n",
            "/workspace/llm4binary/github/license_c_cmakelists/bitcoin[P]bitcoin/src/secp256k1/src/tests.c"
            ,0x1cc7,"test condition failed: secp256k1_memcmp_var(nonce, nonce2, 32) != 0");
    abort();
  }
  iVar2 = secp256k1_memcmp_var(local_4ac8,local_4b08,0x20);
  if (iVar2 == 0) {
    fprintf(_stderr,"%s:%d: %s\n",
            "/workspace/llm4binary/github/license_c_cmakelists/bitcoin[P]bitcoin/src/secp256k1/src/tests.c"
            ,0x1cc8,"test condition failed: secp256k1_memcmp_var(nonce, nonce3, 32) != 0");
    abort();
  }
  iVar2 = secp256k1_memcmp_var(local_4ac8,local_4b28,0x20);
  if (iVar2 == 0) {
    fprintf(_stderr,"%s:%d: %s\n",
            "/workspace/llm4binary/github/license_c_cmakelists/bitcoin[P]bitcoin/src/secp256k1/src/tests.c"
            ,0x1cc9,"test condition failed: secp256k1_memcmp_var(nonce, nonce4, 32) != 0");
    abort();
  }
  iVar2 = secp256k1_memcmp_var(local_4ae8,local_4b08,0x20);
  if (iVar2 == 0) {
    fprintf(_stderr,"%s:%d: %s\n",
            "/workspace/llm4binary/github/license_c_cmakelists/bitcoin[P]bitcoin/src/secp256k1/src/tests.c"
            ,0x1cca,"test condition failed: secp256k1_memcmp_var(nonce2, nonce3, 32) != 0");
    abort();
  }
  iVar2 = secp256k1_memcmp_var(local_4ae8,local_4b28,0x20);
  if (iVar2 == 0) {
    fprintf(_stderr,"%s:%d: %s\n",
            "/workspace/llm4binary/github/license_c_cmakelists/bitcoin[P]bitcoin/src/secp256k1/src/tests.c"
            ,0x1ccb,"test condition failed: secp256k1_memcmp_var(nonce2, nonce4, 32) != 0");
    abort();
  }
  iVar2 = secp256k1_memcmp_var(local_4b08,local_4b28,0x20);
  if (iVar2 == 0) {
    fprintf(_stderr,"%s:%d: %s\n",
            "/workspace/llm4binary/github/license_c_cmakelists/bitcoin[P]bitcoin/src/secp256k1/src/tests.c"
            ,0x1ccc,"test condition failed: secp256k1_memcmp_var(nonce3, nonce4, 32) != 0");
    abort();
  }
  iVar2 = ec_privkey_export_der
                    (in_stack_ffffffffffffb1e8,in_stack_ffffffffffffb1e0,
                     (size_t *)in_stack_ffffffffffffb1d8,(uchar *)in_stack_ffffffffffffb1d0,
                     in_stack_ffffffffffffb1cc);
  if (iVar2 != 0) {
    fprintf(_stderr,"%s:%d: %s\n",
            "/workspace/llm4binary/github/license_c_cmakelists/bitcoin[P]bitcoin/src/secp256k1/src/tests.c"
            ,0x1cda,
            "test condition failed: !ec_privkey_export_der(CTX, privkey, &outlen, seckey, 0)");
    abort();
  }
  iVar2 = ec_privkey_export_der
                    (in_stack_ffffffffffffb1e8,in_stack_ffffffffffffb1e0,
                     (size_t *)in_stack_ffffffffffffb1d8,(uchar *)in_stack_ffffffffffffb1d0,
                     in_stack_ffffffffffffb1cc);
  if (iVar2 != 0) {
    fprintf(_stderr,"%s:%d: %s\n",
            "/workspace/llm4binary/github/license_c_cmakelists/bitcoin[P]bitcoin/src/secp256k1/src/tests.c"
            ,0x1cdc,
            "test condition failed: !ec_privkey_export_der(CTX, privkey, &outlen, seckey, 1)");
    abort();
  }
  return;
}

Assistant:

static void test_ecdsa_edge_cases(void) {
    int t;
    secp256k1_ecdsa_signature sig;

    /* Test the case where ECDSA recomputes a point that is infinity. */
    {
        secp256k1_gej keyj;
        secp256k1_ge key;
        secp256k1_scalar msg;
        secp256k1_scalar sr, ss;
        secp256k1_scalar_set_int(&ss, 1);
        secp256k1_scalar_negate(&ss, &ss);
        secp256k1_scalar_inverse(&ss, &ss);
        secp256k1_scalar_set_int(&sr, 1);
        secp256k1_ecmult_gen(&CTX->ecmult_gen_ctx, &keyj, &sr);
        secp256k1_ge_set_gej(&key, &keyj);
        msg = ss;
        CHECK(secp256k1_ecdsa_sig_verify(&sr, &ss, &key, &msg) == 0);
    }

    /* Verify signature with r of zero fails. */
    {
        const unsigned char pubkey_mods_zero[33] = {
            0x02, 0xff, 0xff, 0xff, 0xff, 0xff, 0xff, 0xff,
            0xff, 0xff, 0xff, 0xff, 0xff, 0xff, 0xff, 0xff,
            0xfe, 0xba, 0xae, 0xdc, 0xe6, 0xaf, 0x48, 0xa0,
            0x3b, 0xbf, 0xd2, 0x5e, 0x8c, 0xd0, 0x36, 0x41,
            0x41
        };
        secp256k1_ge key;
        secp256k1_scalar msg;
        secp256k1_scalar sr, ss;
        secp256k1_scalar_set_int(&ss, 1);
        secp256k1_scalar_set_int(&msg, 0);
        secp256k1_scalar_set_int(&sr, 0);
        CHECK(secp256k1_eckey_pubkey_parse(&key, pubkey_mods_zero, 33));
        CHECK(secp256k1_ecdsa_sig_verify( &sr, &ss, &key, &msg) == 0);
    }

    /* Verify signature with s of zero fails. */
    {
        const unsigned char pubkey[33] = {
            0x02, 0x00, 0x00, 0x00, 0x00, 0x00, 0x00, 0x00,
            0x00, 0x00, 0x00, 0x00, 0x00, 0x00, 0x00, 0x00,
            0x00, 0x00, 0x00, 0x00, 0x00, 0x00, 0x00, 0x00,
            0x00, 0x00, 0x00, 0x00, 0x00, 0x00, 0x00, 0x00,
            0x01
        };
        secp256k1_ge key;
        secp256k1_scalar msg;
        secp256k1_scalar sr, ss;
        secp256k1_scalar_set_int(&ss, 0);
        secp256k1_scalar_set_int(&msg, 0);
        secp256k1_scalar_set_int(&sr, 1);
        CHECK(secp256k1_eckey_pubkey_parse(&key, pubkey, 33));
        CHECK(secp256k1_ecdsa_sig_verify(&sr, &ss, &key, &msg) == 0);
    }

    /* Verify signature with message 0 passes. */
    {
        const unsigned char pubkey[33] = {
            0x02, 0x00, 0x00, 0x00, 0x00, 0x00, 0x00, 0x00,
            0x00, 0x00, 0x00, 0x00, 0x00, 0x00, 0x00, 0x00,
            0x00, 0x00, 0x00, 0x00, 0x00, 0x00, 0x00, 0x00,
            0x00, 0x00, 0x00, 0x00, 0x00, 0x00, 0x00, 0x00,
            0x02
        };
        const unsigned char pubkey2[33] = {
            0x02, 0xff, 0xff, 0xff, 0xff, 0xff, 0xff, 0xff,
            0xff, 0xff, 0xff, 0xff, 0xff, 0xff, 0xff, 0xff,
            0xfe, 0xba, 0xae, 0xdc, 0xe6, 0xaf, 0x48, 0xa0,
            0x3b, 0xbf, 0xd2, 0x5e, 0x8c, 0xd0, 0x36, 0x41,
            0x43
        };
        secp256k1_ge key;
        secp256k1_ge key2;
        secp256k1_scalar msg;
        secp256k1_scalar sr, ss;
        secp256k1_scalar_set_int(&ss, 2);
        secp256k1_scalar_set_int(&msg, 0);
        secp256k1_scalar_set_int(&sr, 2);
        CHECK(secp256k1_eckey_pubkey_parse(&key, pubkey, 33));
        CHECK(secp256k1_eckey_pubkey_parse(&key2, pubkey2, 33));
        CHECK(secp256k1_ecdsa_sig_verify(&sr, &ss, &key, &msg) == 1);
        CHECK(secp256k1_ecdsa_sig_verify(&sr, &ss, &key2, &msg) == 1);
        secp256k1_scalar_negate(&ss, &ss);
        CHECK(secp256k1_ecdsa_sig_verify(&sr, &ss, &key, &msg) == 1);
        CHECK(secp256k1_ecdsa_sig_verify(&sr, &ss, &key2, &msg) == 1);
        secp256k1_scalar_set_int(&ss, 1);
        CHECK(secp256k1_ecdsa_sig_verify(&sr, &ss, &key, &msg) == 0);
        CHECK(secp256k1_ecdsa_sig_verify(&sr, &ss, &key2, &msg) == 0);
    }

    /* Verify signature with message 1 passes. */
    {
        const unsigned char pubkey[33] = {
            0x02, 0x14, 0x4e, 0x5a, 0x58, 0xef, 0x5b, 0x22,
            0x6f, 0xd2, 0xe2, 0x07, 0x6a, 0x77, 0xcf, 0x05,
            0xb4, 0x1d, 0xe7, 0x4a, 0x30, 0x98, 0x27, 0x8c,
            0x93, 0xe6, 0xe6, 0x3c, 0x0b, 0xc4, 0x73, 0x76,
            0x25
        };
        const unsigned char pubkey2[33] = {
            0x02, 0x8a, 0xd5, 0x37, 0xed, 0x73, 0xd9, 0x40,
            0x1d, 0xa0, 0x33, 0xd2, 0xdc, 0xf0, 0xaf, 0xae,
            0x34, 0xcf, 0x5f, 0x96, 0x4c, 0x73, 0x28, 0x0f,
            0x92, 0xc0, 0xf6, 0x9d, 0xd9, 0xb2, 0x09, 0x10,
            0x62
        };
        const unsigned char csr[32] = {
            0x00, 0x00, 0x00, 0x00, 0x00, 0x00, 0x00, 0x00,
            0x00, 0x00, 0x00, 0x00, 0x00, 0x00, 0x00, 0x01,
            0x45, 0x51, 0x23, 0x19, 0x50, 0xb7, 0x5f, 0xc4,
            0x40, 0x2d, 0xa1, 0x72, 0x2f, 0xc9, 0xba, 0xeb
        };
        secp256k1_ge key;
        secp256k1_ge key2;
        secp256k1_scalar msg;
        secp256k1_scalar sr, ss;
        secp256k1_scalar_set_int(&ss, 1);
        secp256k1_scalar_set_int(&msg, 1);
        secp256k1_scalar_set_b32(&sr, csr, NULL);
        CHECK(secp256k1_eckey_pubkey_parse(&key, pubkey, 33));
        CHECK(secp256k1_eckey_pubkey_parse(&key2, pubkey2, 33));
        CHECK(secp256k1_ecdsa_sig_verify(&sr, &ss, &key, &msg) == 1);
        CHECK(secp256k1_ecdsa_sig_verify(&sr, &ss, &key2, &msg) == 1);
        secp256k1_scalar_negate(&ss, &ss);
        CHECK(secp256k1_ecdsa_sig_verify(&sr, &ss, &key, &msg) == 1);
        CHECK(secp256k1_ecdsa_sig_verify(&sr, &ss, &key2, &msg) == 1);
        secp256k1_scalar_set_int(&ss, 2);
        secp256k1_scalar_inverse_var(&ss, &ss);
        CHECK(secp256k1_ecdsa_sig_verify(&sr, &ss, &key, &msg) == 0);
        CHECK(secp256k1_ecdsa_sig_verify(&sr, &ss, &key2, &msg) == 0);
    }

    /* Verify signature with message -1 passes. */
    {
        const unsigned char pubkey[33] = {
            0x03, 0xaf, 0x97, 0xff, 0x7d, 0x3a, 0xf6, 0xa0,
            0x02, 0x94, 0xbd, 0x9f, 0x4b, 0x2e, 0xd7, 0x52,
            0x28, 0xdb, 0x49, 0x2a, 0x65, 0xcb, 0x1e, 0x27,
            0x57, 0x9c, 0xba, 0x74, 0x20, 0xd5, 0x1d, 0x20,
            0xf1
        };
        const unsigned char csr[32] = {
            0x00, 0x00, 0x00, 0x00, 0x00, 0x00, 0x00, 0x00,
            0x00, 0x00, 0x00, 0x00, 0x00, 0x00, 0x00, 0x01,
            0x45, 0x51, 0x23, 0x19, 0x50, 0xb7, 0x5f, 0xc4,
            0x40, 0x2d, 0xa1, 0x72, 0x2f, 0xc9, 0xba, 0xee
        };
        secp256k1_ge key;
        secp256k1_scalar msg;
        secp256k1_scalar sr, ss;
        secp256k1_scalar_set_int(&ss, 1);
        secp256k1_scalar_set_int(&msg, 1);
        secp256k1_scalar_negate(&msg, &msg);
        secp256k1_scalar_set_b32(&sr, csr, NULL);
        CHECK(secp256k1_eckey_pubkey_parse(&key, pubkey, 33));
        CHECK(secp256k1_ecdsa_sig_verify(&sr, &ss, &key, &msg) == 1);
        secp256k1_scalar_negate(&ss, &ss);
        CHECK(secp256k1_ecdsa_sig_verify(&sr, &ss, &key, &msg) == 1);
        secp256k1_scalar_set_int(&ss, 3);
        secp256k1_scalar_inverse_var(&ss, &ss);
        CHECK(secp256k1_ecdsa_sig_verify(&sr, &ss, &key, &msg) == 0);
    }

    /* Signature where s would be zero. */
    {
        secp256k1_pubkey pubkey;
        size_t siglen;
        unsigned char signature[72];
        static const unsigned char nonce[32] = {
            0x00, 0x00, 0x00, 0x00, 0x00, 0x00, 0x00, 0x00,
            0x00, 0x00, 0x00, 0x00, 0x00, 0x00, 0x00, 0x00,
            0x00, 0x00, 0x00, 0x00, 0x00, 0x00, 0x00, 0x00,
            0x00, 0x00, 0x00, 0x00, 0x00, 0x00, 0x00, 0x01,
        };
        static const unsigned char nonce2[32] = {
            0xFF,0xFF,0xFF,0xFF,0xFF,0xFF,0xFF,0xFF,
            0xFF,0xFF,0xFF,0xFF,0xFF,0xFF,0xFF,0xFE,
            0xBA,0xAE,0xDC,0xE6,0xAF,0x48,0xA0,0x3B,
            0xBF,0xD2,0x5E,0x8C,0xD0,0x36,0x41,0x40
        };
        const unsigned char key[32] = {
            0x00, 0x00, 0x00, 0x00, 0x00, 0x00, 0x00, 0x00,
            0x00, 0x00, 0x00, 0x00, 0x00, 0x00, 0x00, 0x00,
            0x00, 0x00, 0x00, 0x00, 0x00, 0x00, 0x00, 0x00,
            0x00, 0x00, 0x00, 0x00, 0x00, 0x00, 0x00, 0x01,
        };
        unsigned char msg[32] = {
            0x86, 0x41, 0x99, 0x81, 0x06, 0x23, 0x44, 0x53,
            0xaa, 0x5f, 0x9d, 0x6a, 0x31, 0x78, 0xf4, 0xf7,
            0xb8, 0x12, 0xe0, 0x0b, 0x81, 0x7a, 0x77, 0x62,
            0x65, 0xdf, 0xdd, 0x31, 0xb9, 0x3e, 0x29, 0xa9,
        };
        CHECK(secp256k1_ecdsa_sign(CTX, &sig, msg, key, precomputed_nonce_function, nonce) == 0);
        CHECK(secp256k1_ecdsa_sign(CTX, &sig, msg, key, precomputed_nonce_function, nonce2) == 0);
        msg[31] = 0xaa;
        CHECK(secp256k1_ecdsa_sign(CTX, &sig, msg, key, precomputed_nonce_function, nonce) == 1);
        CHECK_ILLEGAL(CTX, secp256k1_ecdsa_sign(CTX, NULL, msg, key, precomputed_nonce_function, nonce2));
        CHECK_ILLEGAL(CTX, secp256k1_ecdsa_sign(CTX, &sig, NULL, key, precomputed_nonce_function, nonce2));
        CHECK_ILLEGAL(CTX, secp256k1_ecdsa_sign(CTX, &sig, msg, NULL, precomputed_nonce_function, nonce2));
        CHECK(secp256k1_ecdsa_sign(CTX, &sig, msg, key, precomputed_nonce_function, nonce2) == 1);
        CHECK(secp256k1_ec_pubkey_create(CTX, &pubkey, key) == 1);
        CHECK_ILLEGAL(CTX, secp256k1_ecdsa_verify(CTX, NULL, msg, &pubkey));
        CHECK_ILLEGAL(CTX, secp256k1_ecdsa_verify(CTX, &sig, NULL, &pubkey));
        CHECK_ILLEGAL(CTX, secp256k1_ecdsa_verify(CTX, &sig, msg, NULL));
        CHECK(secp256k1_ecdsa_verify(CTX, &sig, msg, &pubkey) == 1);
        CHECK_ILLEGAL(CTX, secp256k1_ec_pubkey_create(CTX, &pubkey, NULL));
        /* That pubkeyload fails via an ARGCHECK is a little odd but makes sense because pubkeys are an opaque data type. */
        CHECK_ILLEGAL(CTX, secp256k1_ecdsa_verify(CTX, &sig, msg, &pubkey));
        siglen = 72;
        CHECK_ILLEGAL(CTX, secp256k1_ecdsa_signature_serialize_der(CTX, NULL, &siglen, &sig));
        CHECK_ILLEGAL(CTX, secp256k1_ecdsa_signature_serialize_der(CTX, signature, NULL, &sig));
        CHECK_ILLEGAL(CTX, secp256k1_ecdsa_signature_serialize_der(CTX, signature, &siglen, NULL));
        CHECK(secp256k1_ecdsa_signature_serialize_der(CTX, signature, &siglen, &sig) == 1);
        CHECK_ILLEGAL(CTX, secp256k1_ecdsa_signature_parse_der(CTX, NULL, signature, siglen));
        CHECK_ILLEGAL(CTX, secp256k1_ecdsa_signature_parse_der(CTX, &sig, NULL, siglen));
        CHECK(secp256k1_ecdsa_signature_parse_der(CTX, &sig, signature, siglen) == 1);
        siglen = 10;
        /* Too little room for a signature does not fail via ARGCHECK. */
        CHECK(secp256k1_ecdsa_signature_serialize_der(CTX, signature, &siglen, &sig) == 0);
        CHECK_ILLEGAL(CTX, secp256k1_ecdsa_signature_normalize(CTX, NULL, NULL));
        CHECK_ILLEGAL(CTX, secp256k1_ecdsa_signature_serialize_compact(CTX, NULL, &sig));
        CHECK_ILLEGAL(CTX, secp256k1_ecdsa_signature_serialize_compact(CTX, signature, NULL));
        CHECK(secp256k1_ecdsa_signature_serialize_compact(CTX, signature, &sig) == 1);
        CHECK_ILLEGAL(CTX, secp256k1_ecdsa_signature_parse_compact(CTX, NULL, signature));
        CHECK_ILLEGAL(CTX, secp256k1_ecdsa_signature_parse_compact(CTX, &sig, NULL));
        CHECK(secp256k1_ecdsa_signature_parse_compact(CTX, &sig, signature) == 1);
        memset(signature, 255, 64);
        CHECK(secp256k1_ecdsa_signature_parse_compact(CTX, &sig, signature) == 0);
    }

    /* Nonce function corner cases. */
    for (t = 0; t < 2; t++) {
        static const unsigned char zero[32] = {0x00};
        int i;
        unsigned char key[32];
        unsigned char msg[32];
        secp256k1_ecdsa_signature sig2;
        secp256k1_scalar sr[512], ss;
        const unsigned char *extra;
        extra = t == 0 ? NULL : zero;
        memset(msg, 0, 32);
        msg[31] = 1;
        /* High key results in signature failure. */
        memset(key, 0xFF, 32);
        CHECK(secp256k1_ecdsa_sign(CTX, &sig, msg, key, NULL, extra) == 0);
        CHECK(is_empty_signature(&sig));
        /* Zero key results in signature failure. */
        memset(key, 0, 32);
        CHECK(secp256k1_ecdsa_sign(CTX, &sig, msg, key, NULL, extra) == 0);
        CHECK(is_empty_signature(&sig));
        /* Nonce function failure results in signature failure. */
        key[31] = 1;
        CHECK(secp256k1_ecdsa_sign(CTX, &sig, msg, key, nonce_function_test_fail, extra) == 0);
        CHECK(is_empty_signature(&sig));
        /* The retry loop successfully makes its way to the first good value. */
        CHECK(secp256k1_ecdsa_sign(CTX, &sig, msg, key, nonce_function_test_retry, extra) == 1);
        CHECK(!is_empty_signature(&sig));
        CHECK(secp256k1_ecdsa_sign(CTX, &sig2, msg, key, nonce_function_rfc6979, extra) == 1);
        CHECK(!is_empty_signature(&sig2));
        CHECK(secp256k1_memcmp_var(&sig, &sig2, sizeof(sig)) == 0);
        /* The default nonce function is deterministic. */
        CHECK(secp256k1_ecdsa_sign(CTX, &sig2, msg, key, NULL, extra) == 1);
        CHECK(!is_empty_signature(&sig2));
        CHECK(secp256k1_memcmp_var(&sig, &sig2, sizeof(sig)) == 0);
        /* The default nonce function changes output with different messages. */
        for(i = 0; i < 256; i++) {
            int j;
            msg[0] = i;
            CHECK(secp256k1_ecdsa_sign(CTX, &sig2, msg, key, NULL, extra) == 1);
            CHECK(!is_empty_signature(&sig2));
            secp256k1_ecdsa_signature_load(CTX, &sr[i], &ss, &sig2);
            for (j = 0; j < i; j++) {
                CHECK(!secp256k1_scalar_eq(&sr[i], &sr[j]));
            }
        }
        msg[0] = 0;
        msg[31] = 2;
        /* The default nonce function changes output with different keys. */
        for(i = 256; i < 512; i++) {
            int j;
            key[0] = i - 256;
            CHECK(secp256k1_ecdsa_sign(CTX, &sig2, msg, key, NULL, extra) == 1);
            CHECK(!is_empty_signature(&sig2));
            secp256k1_ecdsa_signature_load(CTX, &sr[i], &ss, &sig2);
            for (j = 0; j < i; j++) {
                CHECK(!secp256k1_scalar_eq(&sr[i], &sr[j]));
            }
        }
        key[0] = 0;
    }

    {
        /* Check that optional nonce arguments do not have equivalent effect. */
        const unsigned char zeros[32] = {0};
        unsigned char nonce[32];
        unsigned char nonce2[32];
        unsigned char nonce3[32];
        unsigned char nonce4[32];
        SECP256K1_CHECKMEM_UNDEFINE(nonce,32);
        SECP256K1_CHECKMEM_UNDEFINE(nonce2,32);
        SECP256K1_CHECKMEM_UNDEFINE(nonce3,32);
        SECP256K1_CHECKMEM_UNDEFINE(nonce4,32);
        CHECK(nonce_function_rfc6979(nonce, zeros, zeros, NULL, NULL, 0) == 1);
        SECP256K1_CHECKMEM_CHECK(nonce,32);
        CHECK(nonce_function_rfc6979(nonce2, zeros, zeros, zeros, NULL, 0) == 1);
        SECP256K1_CHECKMEM_CHECK(nonce2,32);
        CHECK(nonce_function_rfc6979(nonce3, zeros, zeros, NULL, (void *)zeros, 0) == 1);
        SECP256K1_CHECKMEM_CHECK(nonce3,32);
        CHECK(nonce_function_rfc6979(nonce4, zeros, zeros, zeros, (void *)zeros, 0) == 1);
        SECP256K1_CHECKMEM_CHECK(nonce4,32);
        CHECK(secp256k1_memcmp_var(nonce, nonce2, 32) != 0);
        CHECK(secp256k1_memcmp_var(nonce, nonce3, 32) != 0);
        CHECK(secp256k1_memcmp_var(nonce, nonce4, 32) != 0);
        CHECK(secp256k1_memcmp_var(nonce2, nonce3, 32) != 0);
        CHECK(secp256k1_memcmp_var(nonce2, nonce4, 32) != 0);
        CHECK(secp256k1_memcmp_var(nonce3, nonce4, 32) != 0);
    }


    /* Privkey export where pubkey is the point at infinity. */
    {
        unsigned char privkey[300];
        unsigned char seckey[32] = {
            0xff, 0xff, 0xff, 0xff, 0xff, 0xff, 0xff, 0xff,
            0xff, 0xff, 0xff, 0xff, 0xff, 0xff, 0xff, 0xfe,
            0xba, 0xae, 0xdc, 0xe6, 0xaf, 0x48, 0xa0, 0x3b,
            0xbf, 0xd2, 0x5e, 0x8c, 0xd0, 0x36, 0x41, 0x41,
        };
        size_t outlen = 300;
        CHECK(!ec_privkey_export_der(CTX, privkey, &outlen, seckey, 0));
        outlen = 300;
        CHECK(!ec_privkey_export_der(CTX, privkey, &outlen, seckey, 1));
    }
}